

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx512::CurveNiIntersectorK<4,8>::
     occluded_n<embree::avx512::OrientedCurve1IntersectorK<embree::CatmullRomCurveT,8>,embree::avx512::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  uint uVar3;
  uint uVar4;
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  void *pvVar7;
  __int_type_conflict _Var8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  undefined8 uVar13;
  undefined8 uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  byte bVar21;
  uint uVar22;
  ulong uVar23;
  long lVar25;
  uint uVar26;
  ulong uVar27;
  ulong uVar28;
  undefined8 in_R10;
  ulong uVar29;
  ulong uVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar88 [32];
  undefined1 auVar90 [32];
  undefined1 auVar92 [32];
  undefined1 auVar94 [32];
  float fVar96;
  vint4 bi_2;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined4 uVar103;
  vint4 bi_1;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  float fVar119;
  float fVar120;
  undefined1 auVar110 [16];
  float fVar121;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [32];
  vint4 ai_2;
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  float fVar131;
  float fVar137;
  float fVar138;
  vint4 bi;
  undefined1 auVar132 [16];
  float fVar139;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [32];
  vint4 ai;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [32];
  vint4 ai_1;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  vfloat4 a0_3;
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  vfloat4 a0_2;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [32];
  float fVar197;
  float fVar198;
  float fVar208;
  float fVar210;
  float fVar212;
  undefined1 auVar199 [16];
  float fVar209;
  float fVar211;
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  float fVar213;
  float fVar214;
  float fVar222;
  float fVar223;
  float fVar224;
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  vfloat4 a0;
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  vfloat4 a0_1;
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [64];
  undefined1 auVar238 [64];
  undefined1 auVar239 [64];
  undefined1 auVar240 [64];
  undefined1 auVar241 [64];
  undefined1 auVar242 [64];
  undefined1 in_ZMM29 [64];
  undefined1 auVar243 [64];
  undefined1 auVar244 [64];
  undefined1 auVar245 [64];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  uint auStack_460 [4];
  RTCFilterFunctionNArguments local_450;
  undefined1 local_420 [32];
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [8];
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  undefined1 local_390 [16];
  undefined1 local_380 [16];
  undefined1 local_370 [8];
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [16];
  undefined1 local_350 [8];
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [16];
  undefined1 local_330 [16];
  undefined1 local_320 [16];
  undefined1 local_310 [16];
  undefined1 local_300 [16];
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [16];
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  undefined1 local_290 [16];
  undefined1 local_280 [16];
  undefined1 local_270 [16];
  undefined8 uStack_260;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined4 local_1e0;
  undefined4 uStack_1dc;
  undefined4 uStack_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  undefined4 uStack_1c8;
  undefined4 uStack_1c4;
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  RTCHitN local_180 [32];
  undefined1 local_160 [32];
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [32];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar24;
  undefined1 auVar87 [32];
  undefined1 auVar89 [32];
  undefined1 auVar91 [32];
  undefined1 auVar93 [32];
  undefined1 auVar95 [32];
  
  uVar23 = (ulong)(byte)prim[1];
  fVar96 = *(float *)(prim + uVar23 * 0x19 + 0x12);
  auVar40 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar40 = vinsertps_avx(auVar40,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar41 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar41 = vinsertps_avx(auVar41,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar40 = vsubps_avx(auVar40,*(undefined1 (*) [16])(prim + uVar23 * 0x19 + 6));
  auVar55._0_4_ = fVar96 * auVar40._0_4_;
  auVar55._4_4_ = fVar96 * auVar40._4_4_;
  auVar55._8_4_ = fVar96 * auVar40._8_4_;
  auVar55._12_4_ = fVar96 * auVar40._12_4_;
  auVar47._0_4_ = fVar96 * auVar41._0_4_;
  auVar47._4_4_ = fVar96 * auVar41._4_4_;
  auVar47._8_4_ = fVar96 * auVar41._8_4_;
  auVar47._12_4_ = fVar96 * auVar41._12_4_;
  auVar40 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar23 * 4 + 6)));
  auVar40 = vcvtdq2ps_avx(auVar40);
  auVar41 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar23 * 5 + 6)));
  auVar37 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar23 * 6 + 6)));
  auVar41 = vcvtdq2ps_avx(auVar41);
  auVar37 = vcvtdq2ps_avx(auVar37);
  auVar42 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar23 * 0xb + 6)));
  auVar42 = vcvtdq2ps_avx(auVar42);
  auVar51 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar23 * 0xc + 6)));
  auVar38 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar23 * 0xd + 6)));
  auVar51 = vcvtdq2ps_avx(auVar51);
  auVar38 = vcvtdq2ps_avx(auVar38);
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar23 * 0x12 + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar50 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar23 * 0x13 + 6)));
  auVar39 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar23 * 0x14 + 6)));
  auVar50 = vcvtdq2ps_avx(auVar50);
  auVar39 = vcvtdq2ps_avx(auVar39);
  auVar60._4_4_ = auVar47._0_4_;
  auVar60._0_4_ = auVar47._0_4_;
  auVar60._8_4_ = auVar47._0_4_;
  auVar60._12_4_ = auVar47._0_4_;
  auVar45 = vshufps_avx(auVar47,auVar47,0x55);
  auVar43 = vshufps_avx(auVar47,auVar47,0xaa);
  fVar96 = auVar43._0_4_;
  auVar62._0_4_ = fVar96 * auVar37._0_4_;
  fVar213 = auVar43._4_4_;
  auVar62._4_4_ = fVar213 * auVar37._4_4_;
  fVar198 = auVar43._8_4_;
  auVar62._8_4_ = fVar198 * auVar37._8_4_;
  fVar209 = auVar43._12_4_;
  auVar62._12_4_ = fVar209 * auVar37._12_4_;
  auVar59._0_4_ = auVar38._0_4_ * fVar96;
  auVar59._4_4_ = auVar38._4_4_ * fVar213;
  auVar59._8_4_ = auVar38._8_4_ * fVar198;
  auVar59._12_4_ = auVar38._12_4_ * fVar209;
  auVar48._0_4_ = auVar39._0_4_ * fVar96;
  auVar48._4_4_ = auVar39._4_4_ * fVar213;
  auVar48._8_4_ = auVar39._8_4_ * fVar198;
  auVar48._12_4_ = auVar39._12_4_ * fVar209;
  auVar43 = vfmadd231ps_fma(auVar62,auVar45,auVar41);
  auVar44 = vfmadd231ps_fma(auVar59,auVar45,auVar51);
  auVar45 = vfmadd231ps_fma(auVar48,auVar50,auVar45);
  auVar46 = vfmadd231ps_fma(auVar43,auVar60,auVar40);
  auVar44 = vfmadd231ps_fma(auVar44,auVar60,auVar42);
  auVar47 = vfmadd231ps_fma(auVar45,auVar12,auVar60);
  auVar61._4_4_ = auVar55._0_4_;
  auVar61._0_4_ = auVar55._0_4_;
  auVar61._8_4_ = auVar55._0_4_;
  auVar61._12_4_ = auVar55._0_4_;
  auVar45 = vshufps_avx(auVar55,auVar55,0x55);
  auVar43 = vshufps_avx(auVar55,auVar55,0xaa);
  auVar37 = vmulps_avx512vl(auVar43,auVar37);
  auVar57._0_4_ = auVar43._0_4_ * auVar38._0_4_;
  auVar57._4_4_ = auVar43._4_4_ * auVar38._4_4_;
  auVar57._8_4_ = auVar43._8_4_ * auVar38._8_4_;
  auVar57._12_4_ = auVar43._12_4_ * auVar38._12_4_;
  auVar54._0_4_ = auVar43._0_4_ * auVar39._0_4_;
  auVar54._4_4_ = auVar43._4_4_ * auVar39._4_4_;
  auVar54._8_4_ = auVar43._8_4_ * auVar39._8_4_;
  auVar54._12_4_ = auVar43._12_4_ * auVar39._12_4_;
  auVar38 = vfmadd231ps_avx512vl(auVar37,auVar45,auVar41);
  auVar41 = vfmadd231ps_fma(auVar57,auVar45,auVar51);
  auVar37 = vfmadd231ps_fma(auVar54,auVar45,auVar50);
  auVar39 = vfmadd231ps_avx512vl(auVar38,auVar61,auVar40);
  auVar51 = vfmadd231ps_fma(auVar41,auVar61,auVar42);
  auVar50 = vfmadd231ps_fma(auVar37,auVar61,auVar12);
  auVar40 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar241 = ZEXT1664(auVar40);
  auVar52._8_4_ = 0x219392ef;
  auVar52._0_8_ = 0x219392ef219392ef;
  auVar52._12_4_ = 0x219392ef;
  auVar41 = vandps_avx512vl(auVar46,auVar40);
  uVar29 = vcmpps_avx512vl(auVar41,auVar52,1);
  bVar31 = (bool)((byte)uVar29 & 1);
  auVar43._0_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar46._0_4_;
  bVar31 = (bool)((byte)(uVar29 >> 1) & 1);
  auVar43._4_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar46._4_4_;
  bVar31 = (bool)((byte)(uVar29 >> 2) & 1);
  auVar43._8_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar46._8_4_;
  bVar31 = (bool)((byte)(uVar29 >> 3) & 1);
  auVar43._12_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar46._12_4_;
  auVar41 = vandps_avx512vl(auVar44,auVar40);
  uVar29 = vcmpps_avx512vl(auVar41,auVar52,1);
  bVar31 = (bool)((byte)uVar29 & 1);
  auVar46._0_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar44._0_4_;
  bVar31 = (bool)((byte)(uVar29 >> 1) & 1);
  auVar46._4_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar44._4_4_;
  bVar31 = (bool)((byte)(uVar29 >> 2) & 1);
  auVar46._8_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar44._8_4_;
  bVar31 = (bool)((byte)(uVar29 >> 3) & 1);
  auVar46._12_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar44._12_4_;
  auVar40 = vandps_avx512vl(auVar47,auVar40);
  uVar29 = vcmpps_avx512vl(auVar40,auVar52,1);
  bVar31 = (bool)((byte)uVar29 & 1);
  auVar44._0_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar47._0_4_;
  bVar31 = (bool)((byte)(uVar29 >> 1) & 1);
  auVar44._4_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar47._4_4_;
  bVar31 = (bool)((byte)(uVar29 >> 2) & 1);
  auVar44._8_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar47._8_4_;
  bVar31 = (bool)((byte)(uVar29 >> 3) & 1);
  auVar44._12_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar47._12_4_;
  auVar40 = vrcp14ps_avx512vl(auVar43);
  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar242 = ZEXT1664(auVar41);
  auVar37 = vfnmadd213ps_avx512vl(auVar43,auVar40,auVar41);
  auVar37 = vfmadd132ps_fma(auVar37,auVar40,auVar40);
  auVar40 = vrcp14ps_avx512vl(auVar46);
  auVar42 = vfnmadd213ps_avx512vl(auVar46,auVar40,auVar41);
  auVar38 = vfmadd132ps_fma(auVar42,auVar40,auVar40);
  auVar40 = vrcp14ps_avx512vl(auVar44);
  auVar41 = vfnmadd213ps_avx512vl(auVar44,auVar40,auVar41);
  auVar12 = vfmadd132ps_fma(auVar41,auVar40,auVar40);
  auVar40._8_8_ = 0;
  auVar40._0_8_ = *(ulong *)(prim + uVar23 * 7 + 6);
  auVar40 = vpmovsxwd_avx(auVar40);
  auVar40 = vcvtdq2ps_avx(auVar40);
  auVar40 = vsubps_avx512vl(auVar40,auVar39);
  auVar53._0_4_ = auVar37._0_4_ * auVar40._0_4_;
  auVar53._4_4_ = auVar37._4_4_ * auVar40._4_4_;
  auVar53._8_4_ = auVar37._8_4_ * auVar40._8_4_;
  auVar53._12_4_ = auVar37._12_4_ * auVar40._12_4_;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = *(ulong *)(prim + uVar23 * 9 + 6);
  auVar40 = vpmovsxwd_avx(auVar41);
  auVar40 = vcvtdq2ps_avx(auVar40);
  auVar40 = vsubps_avx512vl(auVar40,auVar39);
  auVar132._0_4_ = auVar37._0_4_ * auVar40._0_4_;
  auVar132._4_4_ = auVar37._4_4_ * auVar40._4_4_;
  auVar132._8_4_ = auVar37._8_4_ * auVar40._8_4_;
  auVar132._12_4_ = auVar37._12_4_ * auVar40._12_4_;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = *(ulong *)(prim + uVar23 * 0xe + 6);
  auVar40 = vpmovsxwd_avx(auVar37);
  auVar40 = vcvtdq2ps_avx(auVar40);
  auVar40 = vsubps_avx(auVar40,auVar51);
  auVar58._0_4_ = auVar38._0_4_ * auVar40._0_4_;
  auVar58._4_4_ = auVar38._4_4_ * auVar40._4_4_;
  auVar58._8_4_ = auVar38._8_4_ * auVar40._8_4_;
  auVar58._12_4_ = auVar38._12_4_ * auVar40._12_4_;
  auVar37 = vpbroadcastd_avx512vl();
  auVar42._8_8_ = 0;
  auVar42._0_8_ = *(ulong *)(prim + (ulong)(byte)prim[1] * 0x10 + 6);
  auVar40 = vpmovsxwd_avx(auVar42);
  auVar40 = vcvtdq2ps_avx(auVar40);
  auVar41 = vsubps_avx(auVar40,auVar51);
  auVar51._8_8_ = 0;
  auVar51._0_8_ = *(ulong *)(prim + uVar23 * 0x15 + 6);
  auVar40 = vpmovsxwd_avx(auVar51);
  auVar63._0_4_ = auVar38._0_4_ * auVar41._0_4_;
  auVar63._4_4_ = auVar38._4_4_ * auVar41._4_4_;
  auVar63._8_4_ = auVar38._8_4_ * auVar41._8_4_;
  auVar63._12_4_ = auVar38._12_4_ * auVar41._12_4_;
  auVar40 = vcvtdq2ps_avx(auVar40);
  auVar40 = vsubps_avx(auVar40,auVar50);
  auVar56._0_4_ = auVar12._0_4_ * auVar40._0_4_;
  auVar56._4_4_ = auVar12._4_4_ * auVar40._4_4_;
  auVar56._8_4_ = auVar12._8_4_ * auVar40._8_4_;
  auVar56._12_4_ = auVar12._12_4_ * auVar40._12_4_;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = *(ulong *)(prim + uVar23 * 0x17 + 6);
  auVar40 = vpmovsxwd_avx(auVar38);
  auVar40 = vcvtdq2ps_avx(auVar40);
  auVar40 = vsubps_avx(auVar40,auVar50);
  auVar49._0_4_ = auVar12._0_4_ * auVar40._0_4_;
  auVar49._4_4_ = auVar12._4_4_ * auVar40._4_4_;
  auVar49._8_4_ = auVar12._8_4_ * auVar40._8_4_;
  auVar49._12_4_ = auVar12._12_4_ * auVar40._12_4_;
  auVar40 = vpminsd_avx(auVar53,auVar132);
  auVar41 = vpminsd_avx(auVar58,auVar63);
  auVar40 = vmaxps_avx(auVar40,auVar41);
  auVar41 = vpminsd_avx(auVar56,auVar49);
  uVar103 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar12._4_4_ = uVar103;
  auVar12._0_4_ = uVar103;
  auVar12._8_4_ = uVar103;
  auVar12._12_4_ = uVar103;
  auVar41 = vmaxps_avx512vl(auVar41,auVar12);
  auVar40 = vmaxps_avx(auVar40,auVar41);
  auVar50._8_4_ = 0x3f7ffffa;
  auVar50._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar50._12_4_ = 0x3f7ffffa;
  local_3c0 = vmulps_avx512vl(auVar40,auVar50);
  auVar40 = vpmaxsd_avx(auVar53,auVar132);
  auVar41 = vpmaxsd_avx(auVar58,auVar63);
  auVar40 = vminps_avx(auVar40,auVar41);
  auVar41 = vpmaxsd_avx(auVar56,auVar49);
  uVar103 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar39._4_4_ = uVar103;
  auVar39._0_4_ = uVar103;
  auVar39._8_4_ = uVar103;
  auVar39._12_4_ = uVar103;
  auVar41 = vminps_avx512vl(auVar41,auVar39);
  auVar40 = vminps_avx(auVar40,auVar41);
  auVar45._8_4_ = 0x3f800003;
  auVar45._0_8_ = 0x3f8000033f800003;
  auVar45._12_4_ = 0x3f800003;
  auVar40 = vmulps_avx512vl(auVar40,auVar45);
  uVar13 = vcmpps_avx512vl(local_3c0,auVar40,2);
  uVar14 = vpcmpgtd_avx512vl(auVar37,_DAT_01f4ad30);
  uVar29 = CONCAT44((int)((ulong)in_R10 >> 0x20),(uint)((byte)uVar13 & 0xf & (byte)uVar14));
  local_240 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar40 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar245 = ZEXT1664(auVar40);
  auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar237 = ZEXT1664(auVar40);
  auVar244 = ZEXT464(0x3f800000);
  auVar40 = vxorps_avx512vl(in_ZMM29._0_16_,in_ZMM29._0_16_);
  auVar243 = ZEXT1664(auVar40);
LAB_01816fe1:
  if (uVar29 == 0) {
LAB_01818c09:
    return uVar29 != 0;
  }
  lVar25 = 0;
  for (uVar23 = uVar29; (uVar23 & 1) == 0; uVar23 = uVar23 >> 1 | 0x8000000000000000) {
    lVar25 = lVar25 + 1;
  }
  uVar3 = *(uint *)(prim + 2);
  pGVar5 = (context->scene->geometries).items[uVar3].ptr;
  uVar23 = (ulong)*(uint *)(*(long *)&pGVar5->field_0x58 +
                           pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar25 * 4 + 6));
  p_Var6 = pGVar5[1].intersectionFilterN;
  pvVar7 = pGVar5[2].userPtr;
  _Var8 = pGVar5[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar40 = *(undefined1 (*) [16])(_Var8 + uVar23 * (long)pvVar7);
  auVar41 = *(undefined1 (*) [16])(_Var8 + (uVar23 + 1) * (long)pvVar7);
  auVar37 = *(undefined1 (*) [16])(_Var8 + (uVar23 + 2) * (long)pvVar7);
  auVar42 = *(undefined1 (*) [16])(_Var8 + (long)pvVar7 * (uVar23 + 3));
  lVar25 = *(long *)&pGVar5[1].time_range.upper;
  auVar51 = *(undefined1 (*) [16])(lVar25 + (long)p_Var6 * uVar23);
  auVar38 = *(undefined1 (*) [16])(lVar25 + (long)p_Var6 * (uVar23 + 1));
  auVar12 = *(undefined1 (*) [16])(lVar25 + (long)p_Var6 * (uVar23 + 2));
  uVar30 = uVar29 - 1 & uVar29;
  auVar50 = *(undefined1 (*) [16])(lVar25 + (long)p_Var6 * (uVar23 + 3));
  if (uVar30 != 0) {
    uVar28 = uVar30 - 1 & uVar30;
    for (uVar23 = uVar30; (uVar23 & 1) == 0; uVar23 = uVar23 >> 1 | 0x8000000000000000) {
    }
    if (uVar28 != 0) {
      for (; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar39 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar39 = vinsertps_avx(auVar39,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  auVar54 = auVar245._0_16_;
  auVar43 = vmulps_avx512vl(auVar50,auVar54);
  auVar45 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar12,auVar43);
  auVar104._0_4_ = auVar38._0_4_ + auVar45._0_4_;
  auVar104._4_4_ = auVar38._4_4_ + auVar45._4_4_;
  auVar104._8_4_ = auVar38._8_4_ + auVar45._8_4_;
  auVar104._12_4_ = auVar38._12_4_ + auVar45._12_4_;
  auVar44 = vfmadd231ps_avx512vl(auVar104,auVar51,auVar54);
  auVar59 = ZEXT816(0) << 0x40;
  auVar110._0_4_ = auVar50._0_4_ * 0.0;
  auVar110._4_4_ = auVar50._4_4_ * 0.0;
  auVar110._8_4_ = auVar50._8_4_ * 0.0;
  auVar110._12_4_ = auVar50._12_4_ * 0.0;
  auVar63 = auVar237._0_16_;
  auVar45 = vfmadd231ps_avx512vl(auVar110,auVar12,auVar63);
  auVar45 = vfmadd231ps_fma(auVar45,auVar38,auVar59);
  auVar46 = vfnmadd231ps_avx512vl(auVar45,auVar51,auVar63);
  auVar47 = vmulps_avx512vl(auVar42,auVar54);
  auVar45 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar37,auVar47);
  auVar225._0_4_ = auVar45._0_4_ + auVar41._0_4_;
  auVar225._4_4_ = auVar45._4_4_ + auVar41._4_4_;
  auVar225._8_4_ = auVar45._8_4_ + auVar41._8_4_;
  auVar225._12_4_ = auVar45._12_4_ + auVar41._12_4_;
  auVar48 = vfmadd231ps_avx512vl(auVar225,auVar40,auVar54);
  auVar229._0_4_ = auVar42._0_4_ * 0.0;
  auVar229._4_4_ = auVar42._4_4_ * 0.0;
  auVar229._8_4_ = auVar42._8_4_ * 0.0;
  auVar229._12_4_ = auVar42._12_4_ * 0.0;
  auVar45 = vfmadd231ps_avx512vl(auVar229,auVar37,auVar63);
  auVar45 = vfmadd231ps_fma(auVar45,auVar41,auVar59);
  auVar49 = vfnmadd231ps_avx512vl(auVar45,auVar40,auVar63);
  auVar122._0_4_ = auVar12._0_4_ + auVar43._0_4_;
  auVar122._4_4_ = auVar12._4_4_ + auVar43._4_4_;
  auVar122._8_4_ = auVar12._8_4_ + auVar43._8_4_;
  auVar122._12_4_ = auVar12._12_4_ + auVar43._12_4_;
  auVar45 = vfmadd231ps_fma(auVar122,auVar38,auVar59);
  auVar45 = vfmadd231ps_avx512vl(auVar45,auVar51,auVar54);
  auVar50 = vmulps_avx512vl(auVar50,auVar63);
  auVar12 = vfmadd231ps_fma(auVar50,auVar59,auVar12);
  auVar38 = vfnmadd231ps_avx512vl(auVar12,auVar63,auVar38);
  auVar12 = vfmadd231ps_fma(auVar38,auVar59,auVar51);
  auVar179._0_4_ = auVar47._0_4_ + auVar37._0_4_;
  auVar179._4_4_ = auVar47._4_4_ + auVar37._4_4_;
  auVar179._8_4_ = auVar47._8_4_ + auVar37._8_4_;
  auVar179._12_4_ = auVar47._12_4_ + auVar37._12_4_;
  auVar51 = vfmadd231ps_fma(auVar179,auVar41,auVar59);
  auVar51 = vfmadd231ps_avx512vl(auVar51,auVar40,auVar54);
  auVar42 = vmulps_avx512vl(auVar42,auVar63);
  auVar37 = vfmadd231ps_fma(auVar42,auVar59,auVar37);
  auVar41 = vfnmadd231ps_avx512vl(auVar37,auVar63,auVar41);
  auVar38 = vfmadd231ps_fma(auVar41,auVar59,auVar40);
  auVar40 = vshufps_avx(auVar46,auVar46,0xc9);
  auVar41 = vshufps_avx(auVar48,auVar48,0xc9);
  fVar211 = auVar46._0_4_;
  auVar149._0_4_ = fVar211 * auVar41._0_4_;
  fVar119 = auVar46._4_4_;
  auVar149._4_4_ = fVar119 * auVar41._4_4_;
  fVar120 = auVar46._8_4_;
  auVar149._8_4_ = fVar120 * auVar41._8_4_;
  fVar121 = auVar46._12_4_;
  auVar149._12_4_ = fVar121 * auVar41._12_4_;
  auVar41 = vfmsub231ps_fma(auVar149,auVar40,auVar48);
  auVar37 = vshufps_avx(auVar41,auVar41,0xc9);
  auVar41 = vshufps_avx(auVar49,auVar49,0xc9);
  auVar150._0_4_ = fVar211 * auVar41._0_4_;
  auVar150._4_4_ = fVar119 * auVar41._4_4_;
  auVar150._8_4_ = fVar120 * auVar41._8_4_;
  auVar150._12_4_ = fVar121 * auVar41._12_4_;
  auVar40 = vfmsub231ps_fma(auVar150,auVar40,auVar49);
  auVar42 = vshufps_avx(auVar40,auVar40,0xc9);
  auVar40 = vshufps_avx(auVar12,auVar12,0xc9);
  auVar41 = vshufps_avx(auVar51,auVar51,0xc9);
  fVar131 = auVar12._0_4_;
  auVar140._0_4_ = fVar131 * auVar41._0_4_;
  fVar137 = auVar12._4_4_;
  auVar140._4_4_ = fVar137 * auVar41._4_4_;
  fVar138 = auVar12._8_4_;
  auVar140._8_4_ = fVar138 * auVar41._8_4_;
  fVar139 = auVar12._12_4_;
  auVar140._12_4_ = fVar139 * auVar41._12_4_;
  auVar41 = vfmsub231ps_fma(auVar140,auVar40,auVar51);
  auVar51 = vshufps_avx(auVar41,auVar41,0xc9);
  auVar41 = vshufps_avx(auVar38,auVar38,0xc9);
  auVar180._0_4_ = auVar41._0_4_ * fVar131;
  auVar180._4_4_ = auVar41._4_4_ * fVar137;
  auVar180._8_4_ = auVar41._8_4_ * fVar138;
  auVar180._12_4_ = auVar41._12_4_ * fVar139;
  auVar40 = vfmsub231ps_fma(auVar180,auVar40,auVar38);
  auVar38 = vshufps_avx(auVar40,auVar40,0xc9);
  auVar40 = vdpps_avx(auVar37,auVar37,0x7f);
  fVar213 = auVar40._0_4_;
  auVar181._4_12_ = ZEXT812(0) << 0x20;
  auVar181._0_4_ = fVar213;
  auVar41 = vrsqrt14ss_avx512f(auVar59,auVar181);
  auVar50 = vmulss_avx512f(auVar41,ZEXT416(0x3fc00000));
  auVar43 = vmulss_avx512f(auVar40,ZEXT416(0xbf000000));
  fVar96 = auVar41._0_4_;
  fVar96 = auVar50._0_4_ + auVar43._0_4_ * fVar96 * fVar96 * fVar96;
  fVar214 = fVar96 * auVar37._0_4_;
  fVar222 = fVar96 * auVar37._4_4_;
  fVar223 = fVar96 * auVar37._8_4_;
  fVar224 = fVar96 * auVar37._12_4_;
  auVar41 = vdpps_avx(auVar37,auVar42,0x7f);
  auVar192._0_4_ = auVar42._0_4_ * fVar213;
  auVar192._4_4_ = auVar42._4_4_ * fVar213;
  auVar192._8_4_ = auVar42._8_4_ * fVar213;
  auVar192._12_4_ = auVar42._12_4_ * fVar213;
  fVar213 = auVar41._0_4_;
  auVar160._0_4_ = fVar213 * auVar37._0_4_;
  auVar160._4_4_ = fVar213 * auVar37._4_4_;
  auVar160._8_4_ = fVar213 * auVar37._8_4_;
  auVar160._12_4_ = fVar213 * auVar37._12_4_;
  auVar37 = vsubps_avx(auVar192,auVar160);
  auVar41 = vrcp14ss_avx512f(auVar59,auVar181);
  auVar40 = vfnmadd213ss_avx512f(auVar40,auVar41,ZEXT416(0x40000000));
  fVar198 = auVar41._0_4_ * auVar40._0_4_;
  auVar40 = vdpps_avx(auVar51,auVar51,0x7f);
  fVar209 = auVar40._0_4_;
  auVar173._4_12_ = ZEXT812(0) << 0x20;
  auVar173._0_4_ = fVar209;
  auVar41 = vrsqrt14ss_avx512f(auVar59,auVar173);
  auVar42 = vmulss_avx512f(auVar41,ZEXT416(0x3fc00000));
  auVar50 = vmulss_avx512f(auVar40,ZEXT416(0xbf000000));
  fVar213 = auVar41._0_4_;
  fVar213 = auVar42._0_4_ + auVar50._0_4_ * fVar213 * fVar213 * fVar213;
  fVar197 = fVar213 * auVar51._0_4_;
  fVar208 = fVar213 * auVar51._4_4_;
  fVar210 = fVar213 * auVar51._8_4_;
  fVar212 = fVar213 * auVar51._12_4_;
  auVar41 = vdpps_avx(auVar51,auVar38,0x7f);
  auVar151._0_4_ = fVar209 * auVar38._0_4_;
  auVar151._4_4_ = fVar209 * auVar38._4_4_;
  auVar151._8_4_ = fVar209 * auVar38._8_4_;
  auVar151._12_4_ = fVar209 * auVar38._12_4_;
  fVar209 = auVar41._0_4_;
  auVar141._0_4_ = fVar209 * auVar51._0_4_;
  auVar141._4_4_ = fVar209 * auVar51._4_4_;
  auVar141._8_4_ = fVar209 * auVar51._8_4_;
  auVar141._12_4_ = fVar209 * auVar51._12_4_;
  auVar42 = vsubps_avx(auVar151,auVar141);
  auVar41 = vrcp14ss_avx512f(auVar59,auVar173);
  auVar40 = vfnmadd213ss_avx512f(auVar40,auVar41,ZEXT416(0x40000000));
  fVar209 = auVar40._0_4_ * auVar41._0_4_;
  auVar40 = vshufps_avx(auVar44,auVar44,0xff);
  auVar174._0_4_ = fVar214 * auVar40._0_4_;
  auVar174._4_4_ = fVar222 * auVar40._4_4_;
  auVar174._8_4_ = fVar223 * auVar40._8_4_;
  auVar174._12_4_ = fVar224 * auVar40._12_4_;
  local_340 = vsubps_avx(auVar44,auVar174);
  auVar41 = vshufps_avx(auVar46,auVar46,0xff);
  auVar152._0_4_ = auVar41._0_4_ * fVar214 + auVar40._0_4_ * fVar96 * fVar198 * auVar37._0_4_;
  auVar152._4_4_ = auVar41._4_4_ * fVar222 + auVar40._4_4_ * fVar96 * fVar198 * auVar37._4_4_;
  auVar152._8_4_ = auVar41._8_4_ * fVar223 + auVar40._8_4_ * fVar96 * fVar198 * auVar37._8_4_;
  auVar152._12_4_ = auVar41._12_4_ * fVar224 + auVar40._12_4_ * fVar96 * fVar198 * auVar37._12_4_;
  auVar37 = vsubps_avx(auVar46,auVar152);
  local_350._0_4_ = auVar174._0_4_ + auVar44._0_4_;
  local_350._4_4_ = auVar174._4_4_ + auVar44._4_4_;
  fStack_348 = auVar174._8_4_ + auVar44._8_4_;
  fStack_344 = auVar174._12_4_ + auVar44._12_4_;
  auVar40 = vshufps_avx(auVar45,auVar45,0xff);
  auVar153._0_4_ = fVar197 * auVar40._0_4_;
  auVar153._4_4_ = fVar208 * auVar40._4_4_;
  auVar153._8_4_ = fVar210 * auVar40._8_4_;
  auVar153._12_4_ = fVar212 * auVar40._12_4_;
  local_360 = vsubps_avx(auVar45,auVar153);
  auVar41 = vshufps_avx(auVar12,auVar12,0xff);
  auVar111._0_4_ = auVar41._0_4_ * fVar197 + auVar40._0_4_ * fVar213 * auVar42._0_4_ * fVar209;
  auVar111._4_4_ = auVar41._4_4_ * fVar208 + auVar40._4_4_ * fVar213 * auVar42._4_4_ * fVar209;
  auVar111._8_4_ = auVar41._8_4_ * fVar210 + auVar40._8_4_ * fVar213 * auVar42._8_4_ * fVar209;
  auVar111._12_4_ = auVar41._12_4_ * fVar212 + auVar40._12_4_ * fVar213 * auVar42._12_4_ * fVar209;
  auVar40 = vsubps_avx(auVar12,auVar111);
  _local_370 = vaddps_avx512vl(auVar45,auVar153);
  auVar123._0_4_ = auVar37._0_4_ * 0.33333334;
  auVar123._4_4_ = auVar37._4_4_ * 0.33333334;
  auVar123._8_4_ = auVar37._8_4_ * 0.33333334;
  auVar123._12_4_ = auVar37._12_4_ * 0.33333334;
  local_380 = vaddps_avx512vl(local_340,auVar123);
  auVar124._0_4_ = auVar40._0_4_ * 0.33333334;
  auVar124._4_4_ = auVar40._4_4_ * 0.33333334;
  auVar124._8_4_ = auVar40._8_4_ * 0.33333334;
  auVar124._12_4_ = auVar40._12_4_ * 0.33333334;
  local_390 = vsubps_avx512vl(local_360,auVar124);
  auVar105._0_4_ = (fVar211 + auVar152._0_4_) * 0.33333334;
  auVar105._4_4_ = (fVar119 + auVar152._4_4_) * 0.33333334;
  auVar105._8_4_ = (fVar120 + auVar152._8_4_) * 0.33333334;
  auVar105._12_4_ = (fVar121 + auVar152._12_4_) * 0.33333334;
  _local_3a0 = vaddps_avx512vl(_local_350,auVar105);
  auVar106._0_4_ = (fVar131 + auVar111._0_4_) * 0.33333334;
  auVar106._4_4_ = (fVar137 + auVar111._4_4_) * 0.33333334;
  auVar106._8_4_ = (fVar138 + auVar111._8_4_) * 0.33333334;
  auVar106._12_4_ = (fVar139 + auVar111._12_4_) * 0.33333334;
  _local_3b0 = vsubps_avx512vl(_local_370,auVar106);
  local_2c0 = vsubps_avx(local_340,auVar39);
  uVar103 = local_2c0._0_4_;
  auVar112._4_4_ = uVar103;
  auVar112._0_4_ = uVar103;
  auVar112._8_4_ = uVar103;
  auVar112._12_4_ = uVar103;
  auVar40 = vshufps_avx(local_2c0,local_2c0,0x55);
  auVar41 = vshufps_avx(local_2c0,local_2c0,0xaa);
  aVar1 = pre->ray_space[k].vx.field_0;
  aVar2 = pre->ray_space[k].vy.field_0;
  fVar96 = pre->ray_space[k].vz.field_0.m128[0];
  fVar213 = pre->ray_space[k].vz.field_0.m128[1];
  fVar198 = pre->ray_space[k].vz.field_0.m128[2];
  fVar209 = pre->ray_space[k].vz.field_0.m128[3];
  auVar107._0_4_ = fVar96 * auVar41._0_4_;
  auVar107._4_4_ = fVar213 * auVar41._4_4_;
  auVar107._8_4_ = fVar198 * auVar41._8_4_;
  auVar107._12_4_ = fVar209 * auVar41._12_4_;
  auVar40 = vfmadd231ps_fma(auVar107,(undefined1  [16])aVar2,auVar40);
  auVar50 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar1,auVar112);
  local_2d0 = vsubps_avx512vl(local_380,auVar39);
  uVar103 = local_2d0._0_4_;
  auVar125._4_4_ = uVar103;
  auVar125._0_4_ = uVar103;
  auVar125._8_4_ = uVar103;
  auVar125._12_4_ = uVar103;
  auVar40 = vshufps_avx(local_2d0,local_2d0,0x55);
  auVar41 = vshufps_avx(local_2d0,local_2d0,0xaa);
  auVar113._0_4_ = fVar96 * auVar41._0_4_;
  auVar113._4_4_ = fVar213 * auVar41._4_4_;
  auVar113._8_4_ = fVar198 * auVar41._8_4_;
  auVar113._12_4_ = fVar209 * auVar41._12_4_;
  auVar40 = vfmadd231ps_fma(auVar113,(undefined1  [16])aVar2,auVar40);
  auVar45 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar1,auVar125);
  local_2e0 = vsubps_avx512vl(local_390,auVar39);
  uVar103 = local_2e0._0_4_;
  auVar161._4_4_ = uVar103;
  auVar161._0_4_ = uVar103;
  auVar161._8_4_ = uVar103;
  auVar161._12_4_ = uVar103;
  auVar40 = vshufps_avx(local_2e0,local_2e0,0x55);
  auVar41 = vshufps_avx(local_2e0,local_2e0,0xaa);
  auVar126._0_4_ = fVar96 * auVar41._0_4_;
  auVar126._4_4_ = fVar213 * auVar41._4_4_;
  auVar126._8_4_ = fVar198 * auVar41._8_4_;
  auVar126._12_4_ = fVar209 * auVar41._12_4_;
  auVar40 = vfmadd231ps_fma(auVar126,(undefined1  [16])aVar2,auVar40);
  auVar43 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar1,auVar161);
  local_2f0 = vsubps_avx(local_360,auVar39);
  uVar103 = local_2f0._0_4_;
  auVar162._4_4_ = uVar103;
  auVar162._0_4_ = uVar103;
  auVar162._8_4_ = uVar103;
  auVar162._12_4_ = uVar103;
  auVar40 = vshufps_avx(local_2f0,local_2f0,0x55);
  auVar41 = vshufps_avx(local_2f0,local_2f0,0xaa);
  auVar182._0_4_ = auVar41._0_4_ * fVar96;
  auVar182._4_4_ = auVar41._4_4_ * fVar213;
  auVar182._8_4_ = auVar41._8_4_ * fVar198;
  auVar182._12_4_ = auVar41._12_4_ * fVar209;
  auVar40 = vfmadd231ps_fma(auVar182,(undefined1  [16])aVar2,auVar40);
  auVar44 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar1,auVar162);
  local_300 = vsubps_avx(_local_350,auVar39);
  uVar103 = local_300._0_4_;
  auVar163._4_4_ = uVar103;
  auVar163._0_4_ = uVar103;
  auVar163._8_4_ = uVar103;
  auVar163._12_4_ = uVar103;
  auVar40 = vshufps_avx(local_300,local_300,0x55);
  auVar41 = vshufps_avx(local_300,local_300,0xaa);
  auVar193._0_4_ = auVar41._0_4_ * fVar96;
  auVar193._4_4_ = auVar41._4_4_ * fVar213;
  auVar193._8_4_ = auVar41._8_4_ * fVar198;
  auVar193._12_4_ = auVar41._12_4_ * fVar209;
  auVar40 = vfmadd231ps_fma(auVar193,(undefined1  [16])aVar2,auVar40);
  auVar46 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar1,auVar163);
  local_310 = vsubps_avx512vl(_local_3a0,auVar39);
  uVar103 = local_310._0_4_;
  auVar164._4_4_ = uVar103;
  auVar164._0_4_ = uVar103;
  auVar164._8_4_ = uVar103;
  auVar164._12_4_ = uVar103;
  auVar40 = vshufps_avx(local_310,local_310,0x55);
  auVar41 = vshufps_avx(local_310,local_310,0xaa);
  auVar199._0_4_ = auVar41._0_4_ * fVar96;
  auVar199._4_4_ = auVar41._4_4_ * fVar213;
  auVar199._8_4_ = auVar41._8_4_ * fVar198;
  auVar199._12_4_ = auVar41._12_4_ * fVar209;
  auVar40 = vfmadd231ps_fma(auVar199,(undefined1  [16])aVar2,auVar40);
  auVar47 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar1,auVar164);
  local_320 = vsubps_avx512vl(_local_3b0,auVar39);
  uVar103 = local_320._0_4_;
  auVar165._4_4_ = uVar103;
  auVar165._0_4_ = uVar103;
  auVar165._8_4_ = uVar103;
  auVar165._12_4_ = uVar103;
  auVar40 = vshufps_avx(local_320,local_320,0x55);
  auVar41 = vshufps_avx(local_320,local_320,0xaa);
  auVar215._0_4_ = auVar41._0_4_ * fVar96;
  auVar215._4_4_ = auVar41._4_4_ * fVar213;
  auVar215._8_4_ = auVar41._8_4_ * fVar198;
  auVar215._12_4_ = auVar41._12_4_ * fVar209;
  auVar40 = vfmadd231ps_fma(auVar215,(undefined1  [16])aVar2,auVar40);
  auVar48 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar1,auVar165);
  local_330 = vsubps_avx512vl(_local_370,auVar39);
  uVar103 = local_330._0_4_;
  auVar97._4_4_ = uVar103;
  auVar97._0_4_ = uVar103;
  auVar97._8_4_ = uVar103;
  auVar97._12_4_ = uVar103;
  auVar40 = vshufps_avx(local_330,local_330,0x55);
  auVar41 = vshufps_avx(local_330,local_330,0xaa);
  auVar154._0_4_ = auVar41._0_4_ * fVar96;
  auVar154._4_4_ = auVar41._4_4_ * fVar213;
  auVar154._8_4_ = auVar41._8_4_ * fVar198;
  auVar154._12_4_ = auVar41._12_4_ * fVar209;
  auVar40 = vfmadd231ps_fma(auVar154,(undefined1  [16])aVar2,auVar40);
  auVar39 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar1,auVar97);
  auVar37 = vmovlhps_avx(auVar50,auVar46);
  auVar38 = vmovlhps_avx512f(auVar45,auVar47);
  auVar12 = vmovlhps_avx512f(auVar43,auVar48);
  _local_2a0 = vmovlhps_avx512f(auVar44,auVar39);
  auVar40 = vminps_avx512vl(auVar37,auVar38);
  auVar42 = vmaxps_avx512vl(auVar37,auVar38);
  auVar41 = vminps_avx512vl(auVar12,_local_2a0);
  auVar41 = vminps_avx(auVar40,auVar41);
  auVar40 = vmaxps_avx512vl(auVar12,_local_2a0);
  auVar40 = vmaxps_avx(auVar42,auVar40);
  auVar42 = vshufpd_avx(auVar41,auVar41,3);
  auVar51 = vshufpd_avx(auVar40,auVar40,3);
  auVar41 = vminps_avx(auVar41,auVar42);
  auVar40 = vmaxps_avx(auVar40,auVar51);
  auVar41 = vandps_avx512vl(auVar41,auVar241._0_16_);
  auVar40 = vandps_avx512vl(auVar40,auVar241._0_16_);
  auVar40 = vmaxps_avx(auVar41,auVar40);
  auVar41 = vmovshdup_avx(auVar40);
  auVar40 = vmaxss_avx(auVar41,auVar40);
  fVar96 = auVar40._0_4_ * 9.536743e-07;
  auVar166._8_8_ = auVar50._0_8_;
  auVar166._0_8_ = auVar50._0_8_;
  auVar41 = vmovddup_avx512vl(auVar45);
  auVar42 = vmovddup_avx512vl(auVar43);
  auVar183._0_8_ = auVar44._0_8_;
  auVar183._8_8_ = auVar183._0_8_;
  local_2b0 = ZEXT416((uint)fVar96);
  auVar98._4_4_ = fVar96;
  auVar98._0_4_ = fVar96;
  auVar98._8_4_ = fVar96;
  auVar98._12_4_ = fVar96;
  local_1c0._16_4_ = fVar96;
  local_1c0._0_16_ = auVar98;
  local_1c0._20_4_ = fVar96;
  local_1c0._24_4_ = fVar96;
  local_1c0._28_4_ = fVar96;
  auVar40 = vxorps_avx512vl(auVar98,auVar54);
  local_1e0 = auVar40._0_4_;
  uStack_1dc = local_1e0;
  uStack_1d8 = local_1e0;
  uStack_1d4 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1cc = local_1e0;
  uStack_1c8 = local_1e0;
  uStack_1c4 = local_1e0;
  local_200 = vpbroadcastd_avx512vl();
  bVar31 = false;
  uVar23 = 0;
  fVar96 = *(float *)(ray + k * 4 + 0x60);
  local_270 = vsubps_avx512vl(auVar38,auVar37);
  local_280 = vsubps_avx512vl(auVar12,auVar38);
  local_290 = vsubps_avx512vl(_local_2a0,auVar12);
  local_3d0 = vsubps_avx(_local_350,local_340);
  local_3e0 = vsubps_avx512vl(_local_3a0,local_380);
  local_3f0 = vsubps_avx512vl(_local_3b0,local_390);
  _local_400 = vsubps_avx512vl(_local_370,local_360);
  local_220 = vpbroadcastd_avx512vl();
  auVar40 = ZEXT816(0x3f80000000000000);
  auVar108 = auVar40;
LAB_01817745:
  auVar51 = vshufps_avx(auVar108,auVar108,0x50);
  auVar230._8_4_ = 0x3f800000;
  auVar230._0_8_ = 0x3f8000003f800000;
  auVar230._12_4_ = 0x3f800000;
  auVar84._16_4_ = 0x3f800000;
  auVar84._0_16_ = auVar230;
  auVar84._20_4_ = 0x3f800000;
  auVar84._24_4_ = 0x3f800000;
  auVar84._28_4_ = 0x3f800000;
  auVar50 = vsubps_avx(auVar230,auVar51);
  fVar213 = auVar51._0_4_;
  fVar119 = auVar46._0_4_;
  auVar133._0_4_ = fVar119 * fVar213;
  fVar198 = auVar51._4_4_;
  fVar120 = auVar46._4_4_;
  auVar133._4_4_ = fVar120 * fVar198;
  fVar209 = auVar51._8_4_;
  auVar133._8_4_ = fVar119 * fVar209;
  fVar211 = auVar51._12_4_;
  auVar133._12_4_ = fVar120 * fVar211;
  fVar121 = auVar47._0_4_;
  auVar142._0_4_ = fVar121 * fVar213;
  fVar131 = auVar47._4_4_;
  auVar142._4_4_ = fVar131 * fVar198;
  auVar142._8_4_ = fVar121 * fVar209;
  auVar142._12_4_ = fVar131 * fVar211;
  fVar137 = auVar48._0_4_;
  auVar155._0_4_ = fVar137 * fVar213;
  fVar138 = auVar48._4_4_;
  auVar155._4_4_ = fVar138 * fVar198;
  auVar155._8_4_ = fVar137 * fVar209;
  auVar155._12_4_ = fVar138 * fVar211;
  fVar139 = auVar39._0_4_;
  auVar114._0_4_ = fVar139 * fVar213;
  fVar197 = auVar39._4_4_;
  auVar114._4_4_ = fVar197 * fVar198;
  auVar114._8_4_ = fVar139 * fVar209;
  auVar114._12_4_ = fVar197 * fVar211;
  auVar45 = vfmadd231ps_fma(auVar133,auVar50,auVar166);
  auVar43 = vfmadd231ps_avx512vl(auVar142,auVar50,auVar41);
  auVar44 = vfmadd231ps_avx512vl(auVar155,auVar50,auVar42);
  auVar50 = vfmadd231ps_fma(auVar114,auVar183,auVar50);
  auVar51 = vmovshdup_avx(auVar40);
  fVar198 = auVar40._0_4_;
  fVar213 = (auVar51._0_4_ - fVar198) * 0.04761905;
  auVar78._4_4_ = fVar198;
  auVar78._0_4_ = fVar198;
  auVar78._8_4_ = fVar198;
  auVar78._12_4_ = fVar198;
  auVar78._16_4_ = fVar198;
  auVar78._20_4_ = fVar198;
  auVar78._24_4_ = fVar198;
  auVar78._28_4_ = fVar198;
  auVar68._0_8_ = auVar51._0_8_;
  auVar68._8_8_ = auVar68._0_8_;
  auVar68._16_8_ = auVar68._0_8_;
  auVar68._24_8_ = auVar68._0_8_;
  auVar81 = vsubps_avx(auVar68,auVar78);
  uVar103 = auVar45._0_4_;
  auVar82._4_4_ = uVar103;
  auVar82._0_4_ = uVar103;
  auVar82._8_4_ = uVar103;
  auVar82._12_4_ = uVar103;
  auVar82._16_4_ = uVar103;
  auVar82._20_4_ = uVar103;
  auVar82._24_4_ = uVar103;
  auVar82._28_4_ = uVar103;
  auVar70._8_4_ = 1;
  auVar70._0_8_ = 0x100000001;
  auVar70._12_4_ = 1;
  auVar70._16_4_ = 1;
  auVar70._20_4_ = 1;
  auVar70._24_4_ = 1;
  auVar70._28_4_ = 1;
  auVar80 = ZEXT1632(auVar45);
  auVar79 = vpermps_avx2(auVar70,auVar80);
  auVar64 = vbroadcastss_avx512vl(auVar43);
  auVar74 = ZEXT1632(auVar43);
  auVar65 = vpermps_avx512vl(auVar70,auVar74);
  auVar66 = vbroadcastss_avx512vl(auVar44);
  auVar75 = ZEXT1632(auVar44);
  auVar67 = vpermps_avx512vl(auVar70,auVar75);
  auVar68 = vbroadcastss_avx512vl(auVar50);
  auVar77 = ZEXT1632(auVar50);
  auVar69 = vpermps_avx512vl(auVar70,auVar77);
  auVar83._4_4_ = fVar213;
  auVar83._0_4_ = fVar213;
  auVar83._8_4_ = fVar213;
  auVar83._12_4_ = fVar213;
  auVar83._16_4_ = fVar213;
  auVar83._20_4_ = fVar213;
  auVar83._24_4_ = fVar213;
  auVar83._28_4_ = fVar213;
  auVar76._8_4_ = 2;
  auVar76._0_8_ = 0x200000002;
  auVar76._12_4_ = 2;
  auVar76._16_4_ = 2;
  auVar76._20_4_ = 2;
  auVar76._24_4_ = 2;
  auVar76._28_4_ = 2;
  auVar70 = vpermps_avx512vl(auVar76,auVar80);
  auVar71 = vbroadcastss_avx512vl(ZEXT416(3));
  auVar72 = vpermps_avx512vl(auVar71,auVar80);
  auVar73 = vpermps_avx512vl(auVar76,auVar74);
  auVar74 = vpermps_avx512vl(auVar71,auVar74);
  auVar80 = vpermps_avx2(auVar76,auVar75);
  auVar75 = vpermps_avx512vl(auVar71,auVar75);
  auVar76 = vpermps_avx512vl(auVar76,auVar77);
  auVar71 = vpermps_avx512vl(auVar71,auVar77);
  auVar51 = vfmadd132ps_fma(auVar81,auVar78,_DAT_01f7b040);
  auVar81 = vsubps_avx(auVar84,ZEXT1632(auVar51));
  auVar77 = vmulps_avx512vl(auVar64,ZEXT1632(auVar51));
  auVar84 = ZEXT1632(auVar51);
  auVar78 = vmulps_avx512vl(auVar65,auVar84);
  auVar50 = vfmadd231ps_fma(auVar77,auVar81,auVar82);
  auVar45 = vfmadd231ps_fma(auVar78,auVar81,auVar79);
  auVar77 = vmulps_avx512vl(auVar66,auVar84);
  auVar78 = vmulps_avx512vl(auVar67,auVar84);
  auVar77 = vfmadd231ps_avx512vl(auVar77,auVar81,auVar64);
  auVar78 = vfmadd231ps_avx512vl(auVar78,auVar81,auVar65);
  auVar64 = vmulps_avx512vl(auVar68,auVar84);
  auVar82 = ZEXT1632(auVar51);
  auVar65 = vmulps_avx512vl(auVar69,auVar82);
  auVar66 = vfmadd231ps_avx512vl(auVar64,auVar81,auVar66);
  auVar67 = vfmadd231ps_avx512vl(auVar65,auVar81,auVar67);
  fVar209 = auVar51._0_4_;
  fVar211 = auVar51._4_4_;
  auVar64._4_4_ = fVar211 * auVar77._4_4_;
  auVar64._0_4_ = fVar209 * auVar77._0_4_;
  fVar208 = auVar51._8_4_;
  auVar64._8_4_ = fVar208 * auVar77._8_4_;
  fVar210 = auVar51._12_4_;
  auVar64._12_4_ = fVar210 * auVar77._12_4_;
  auVar64._16_4_ = auVar77._16_4_ * 0.0;
  auVar64._20_4_ = auVar77._20_4_ * 0.0;
  auVar64._24_4_ = auVar77._24_4_ * 0.0;
  auVar64._28_4_ = fVar198;
  auVar65._4_4_ = fVar211 * auVar78._4_4_;
  auVar65._0_4_ = fVar209 * auVar78._0_4_;
  auVar65._8_4_ = fVar208 * auVar78._8_4_;
  auVar65._12_4_ = fVar210 * auVar78._12_4_;
  auVar65._16_4_ = auVar78._16_4_ * 0.0;
  auVar65._20_4_ = auVar78._20_4_ * 0.0;
  auVar65._24_4_ = auVar78._24_4_ * 0.0;
  auVar65._28_4_ = auVar79._28_4_;
  auVar50 = vfmadd231ps_fma(auVar64,auVar81,ZEXT1632(auVar50));
  auVar45 = vfmadd231ps_fma(auVar65,auVar81,ZEXT1632(auVar45));
  auVar69._0_4_ = fVar209 * auVar66._0_4_;
  auVar69._4_4_ = fVar211 * auVar66._4_4_;
  auVar69._8_4_ = fVar208 * auVar66._8_4_;
  auVar69._12_4_ = fVar210 * auVar66._12_4_;
  auVar69._16_4_ = auVar66._16_4_ * 0.0;
  auVar69._20_4_ = auVar66._20_4_ * 0.0;
  auVar69._24_4_ = auVar66._24_4_ * 0.0;
  auVar69._28_4_ = 0;
  auVar79._4_4_ = fVar211 * auVar67._4_4_;
  auVar79._0_4_ = fVar209 * auVar67._0_4_;
  auVar79._8_4_ = fVar208 * auVar67._8_4_;
  auVar79._12_4_ = fVar210 * auVar67._12_4_;
  auVar79._16_4_ = auVar67._16_4_ * 0.0;
  auVar79._20_4_ = auVar67._20_4_ * 0.0;
  auVar79._24_4_ = auVar67._24_4_ * 0.0;
  auVar79._28_4_ = auVar66._28_4_;
  auVar43 = vfmadd231ps_fma(auVar69,auVar81,auVar77);
  auVar44 = vfmadd231ps_fma(auVar79,auVar81,auVar78);
  auVar66._28_4_ = auVar78._28_4_;
  auVar66._0_28_ =
       ZEXT1628(CONCAT412(fVar210 * auVar44._12_4_,
                          CONCAT48(fVar208 * auVar44._8_4_,
                                   CONCAT44(fVar211 * auVar44._4_4_,fVar209 * auVar44._0_4_))));
  auVar49 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar210 * auVar43._12_4_,
                                               CONCAT48(fVar208 * auVar43._8_4_,
                                                        CONCAT44(fVar211 * auVar43._4_4_,
                                                                 fVar209 * auVar43._0_4_)))),auVar81
                            ,ZEXT1632(auVar50));
  auVar59 = vfmadd231ps_fma(auVar66,auVar81,ZEXT1632(auVar45));
  auVar79 = vsubps_avx(ZEXT1632(auVar43),ZEXT1632(auVar50));
  auVar64 = vsubps_avx(ZEXT1632(auVar44),ZEXT1632(auVar45));
  auVar65 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar79 = vmulps_avx512vl(auVar79,auVar65);
  auVar64 = vmulps_avx512vl(auVar64,auVar65);
  auVar77._0_4_ = fVar213 * auVar79._0_4_;
  auVar77._4_4_ = fVar213 * auVar79._4_4_;
  auVar77._8_4_ = fVar213 * auVar79._8_4_;
  auVar77._12_4_ = fVar213 * auVar79._12_4_;
  auVar77._16_4_ = fVar213 * auVar79._16_4_;
  auVar77._20_4_ = fVar213 * auVar79._20_4_;
  auVar77._24_4_ = fVar213 * auVar79._24_4_;
  auVar77._28_4_ = 0;
  auVar79 = vmulps_avx512vl(auVar83,auVar64);
  auVar45 = vxorps_avx512vl(auVar68._0_16_,auVar68._0_16_);
  auVar64 = vpermt2ps_avx512vl(ZEXT1632(auVar49),_DAT_01fb9fc0,ZEXT1632(auVar45));
  auVar66 = vpermt2ps_avx512vl(ZEXT1632(auVar59),_DAT_01fb9fc0,ZEXT1632(auVar45));
  auVar118._0_4_ = auVar77._0_4_ + auVar49._0_4_;
  auVar118._4_4_ = auVar77._4_4_ + auVar49._4_4_;
  auVar118._8_4_ = auVar77._8_4_ + auVar49._8_4_;
  auVar118._12_4_ = auVar77._12_4_ + auVar49._12_4_;
  auVar118._16_4_ = auVar77._16_4_ + 0.0;
  auVar118._20_4_ = auVar77._20_4_ + 0.0;
  auVar118._24_4_ = auVar77._24_4_ + 0.0;
  auVar118._28_4_ = 0;
  auVar78 = ZEXT1632(auVar45);
  auVar67 = vpermt2ps_avx512vl(auVar77,_DAT_01fb9fc0,auVar78);
  auVar68 = vaddps_avx512vl(ZEXT1632(auVar59),auVar79);
  auVar69 = vpermt2ps_avx512vl(auVar79,_DAT_01fb9fc0,auVar78);
  auVar79 = vsubps_avx(auVar64,auVar67);
  auVar69 = vsubps_avx512vl(auVar66,auVar69);
  auVar67 = vmulps_avx512vl(auVar73,auVar82);
  auVar77 = vmulps_avx512vl(auVar74,auVar82);
  auVar67 = vfmadd231ps_avx512vl(auVar67,auVar81,auVar70);
  auVar70 = vfmadd231ps_avx512vl(auVar77,auVar81,auVar72);
  auVar72 = vmulps_avx512vl(auVar80,auVar82);
  auVar77 = vmulps_avx512vl(auVar75,auVar82);
  auVar72 = vfmadd231ps_avx512vl(auVar72,auVar81,auVar73);
  auVar73 = vfmadd231ps_avx512vl(auVar77,auVar81,auVar74);
  auVar74 = vmulps_avx512vl(auVar76,auVar82);
  auVar71 = vmulps_avx512vl(auVar71,auVar82);
  auVar50 = vfmadd231ps_fma(auVar74,auVar81,auVar80);
  auVar80 = vfmadd231ps_avx512vl(auVar71,auVar81,auVar75);
  auVar71 = vmulps_avx512vl(auVar82,auVar72);
  auVar76 = ZEXT1632(auVar51);
  auVar74 = vmulps_avx512vl(auVar76,auVar73);
  auVar67 = vfmadd231ps_avx512vl(auVar71,auVar81,auVar67);
  auVar70 = vfmadd231ps_avx512vl(auVar74,auVar81,auVar70);
  auVar80 = vmulps_avx512vl(auVar76,auVar80);
  auVar71 = vfmadd231ps_avx512vl
                      (ZEXT1632(CONCAT412(fVar210 * auVar50._12_4_,
                                          CONCAT48(fVar208 * auVar50._8_4_,
                                                   CONCAT44(fVar211 * auVar50._4_4_,
                                                            fVar209 * auVar50._0_4_)))),auVar81,
                       auVar72);
  auVar72 = vfmadd231ps_avx512vl(auVar80,auVar81,auVar73);
  auVar80._4_4_ = fVar211 * auVar71._4_4_;
  auVar80._0_4_ = fVar209 * auVar71._0_4_;
  auVar80._8_4_ = fVar208 * auVar71._8_4_;
  auVar80._12_4_ = fVar210 * auVar71._12_4_;
  auVar80._16_4_ = auVar71._16_4_ * 0.0;
  auVar80._20_4_ = auVar71._20_4_ * 0.0;
  auVar80._24_4_ = auVar71._24_4_ * 0.0;
  auVar80._28_4_ = auVar75._28_4_;
  auVar73 = vmulps_avx512vl(auVar76,auVar72);
  auVar80 = vfmadd231ps_avx512vl(auVar80,auVar81,auVar67);
  auVar73 = vfmadd231ps_avx512vl(auVar73,auVar70,auVar81);
  auVar81 = vsubps_avx512vl(auVar71,auVar67);
  auVar67 = vsubps_avx512vl(auVar72,auVar70);
  auVar70 = vmulps_avx512vl(auVar81,auVar65);
  auVar65 = vmulps_avx512vl(auVar67,auVar65);
  fVar198 = fVar213 * auVar70._0_4_;
  fVar209 = fVar213 * auVar70._4_4_;
  auVar81._4_4_ = fVar209;
  auVar81._0_4_ = fVar198;
  fVar211 = fVar213 * auVar70._8_4_;
  auVar81._8_4_ = fVar211;
  fVar208 = fVar213 * auVar70._12_4_;
  auVar81._12_4_ = fVar208;
  fVar210 = fVar213 * auVar70._16_4_;
  auVar81._16_4_ = fVar210;
  fVar212 = fVar213 * auVar70._20_4_;
  auVar81._20_4_ = fVar212;
  fVar213 = fVar213 * auVar70._24_4_;
  auVar81._24_4_ = fVar213;
  auVar81._28_4_ = auVar70._28_4_;
  auVar65 = vmulps_avx512vl(auVar83,auVar65);
  auVar71 = vpermt2ps_avx512vl(auVar80,_DAT_01fb9fc0,auVar78);
  auVar72 = vpermt2ps_avx512vl(auVar73,_DAT_01fb9fc0,auVar78);
  auVar196._0_4_ = auVar80._0_4_ + fVar198;
  auVar196._4_4_ = auVar80._4_4_ + fVar209;
  auVar196._8_4_ = auVar80._8_4_ + fVar211;
  auVar196._12_4_ = auVar80._12_4_ + fVar208;
  auVar196._16_4_ = auVar80._16_4_ + fVar210;
  auVar196._20_4_ = auVar80._20_4_ + fVar212;
  auVar196._24_4_ = auVar80._24_4_ + fVar213;
  auVar196._28_4_ = auVar80._28_4_ + auVar70._28_4_;
  auVar81 = vpermt2ps_avx512vl(auVar81,_DAT_01fb9fc0,ZEXT1632(auVar45));
  auVar70 = vaddps_avx512vl(auVar73,auVar65);
  auVar65 = vpermt2ps_avx512vl(auVar65,_DAT_01fb9fc0,ZEXT1632(auVar45));
  auVar81 = vsubps_avx(auVar71,auVar81);
  auVar65 = vsubps_avx512vl(auVar72,auVar65);
  auVar85 = ZEXT1632(auVar49);
  auVar67 = vsubps_avx512vl(auVar80,auVar85);
  auVar87 = ZEXT1632(auVar59);
  auVar74 = vsubps_avx512vl(auVar73,auVar87);
  auVar75 = vsubps_avx512vl(auVar71,auVar64);
  auVar67 = vaddps_avx512vl(auVar67,auVar75);
  auVar75 = vsubps_avx512vl(auVar72,auVar66);
  auVar74 = vaddps_avx512vl(auVar74,auVar75);
  auVar75 = vmulps_avx512vl(auVar87,auVar67);
  auVar75 = vfnmadd231ps_avx512vl(auVar75,auVar85,auVar74);
  auVar76 = vmulps_avx512vl(auVar68,auVar67);
  auVar76 = vfnmadd231ps_avx512vl(auVar76,auVar118,auVar74);
  auVar77 = vmulps_avx512vl(auVar69,auVar67);
  auVar77 = vfnmadd231ps_avx512vl(auVar77,auVar79,auVar74);
  auVar78 = vmulps_avx512vl(auVar66,auVar67);
  auVar78 = vfnmadd231ps_avx512vl(auVar78,auVar64,auVar74);
  auVar82 = vmulps_avx512vl(auVar73,auVar67);
  auVar82 = vfnmadd231ps_avx512vl(auVar82,auVar80,auVar74);
  auVar83 = vmulps_avx512vl(auVar70,auVar67);
  auVar83 = vfnmadd231ps_avx512vl(auVar83,auVar196,auVar74);
  auVar84 = vmulps_avx512vl(auVar65,auVar67);
  auVar84 = vfnmadd231ps_avx512vl(auVar84,auVar81,auVar74);
  auVar67 = vmulps_avx512vl(auVar72,auVar67);
  auVar67 = vfnmadd231ps_avx512vl(auVar67,auVar71,auVar74);
  auVar74 = vminps_avx512vl(auVar75,auVar76);
  auVar75 = vmaxps_avx512vl(auVar75,auVar76);
  auVar76 = vminps_avx512vl(auVar77,auVar78);
  auVar74 = vminps_avx512vl(auVar74,auVar76);
  auVar76 = vmaxps_avx512vl(auVar77,auVar78);
  auVar75 = vmaxps_avx512vl(auVar75,auVar76);
  auVar76 = vminps_avx512vl(auVar82,auVar83);
  auVar77 = vmaxps_avx512vl(auVar82,auVar83);
  auVar78 = vminps_avx512vl(auVar84,auVar67);
  auVar76 = vminps_avx512vl(auVar76,auVar78);
  auVar74 = vminps_avx512vl(auVar74,auVar76);
  auVar67 = vmaxps_avx512vl(auVar84,auVar67);
  auVar67 = vmaxps_avx512vl(auVar77,auVar67);
  auVar75 = vmaxps_avx512vl(auVar75,auVar67);
  uVar13 = vcmpps_avx512vl(auVar74,local_1c0,2);
  auVar67._4_4_ = uStack_1dc;
  auVar67._0_4_ = local_1e0;
  auVar67._8_4_ = uStack_1d8;
  auVar67._12_4_ = uStack_1d4;
  auVar67._16_4_ = uStack_1d0;
  auVar67._20_4_ = uStack_1cc;
  auVar67._24_4_ = uStack_1c8;
  auVar67._28_4_ = uStack_1c4;
  uVar14 = vcmpps_avx512vl(auVar75,auVar67,5);
  bVar21 = (byte)uVar13 & (byte)uVar14 & 0x7f;
  if (bVar21 == 0) {
    auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar237 = ZEXT1664(auVar40);
    auVar81 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar238 = ZEXT3264(auVar81);
    auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
    auVar239 = ZEXT1664(auVar40);
    auVar240 = ZEXT3264(_DAT_01fb9fe0);
  }
  else {
    auVar74 = vsubps_avx512vl(auVar64,auVar85);
    auVar75 = vsubps_avx512vl(auVar66,auVar87);
    auVar76 = vsubps_avx512vl(auVar71,auVar80);
    auVar74 = vaddps_avx512vl(auVar74,auVar76);
    auVar76 = vsubps_avx512vl(auVar72,auVar73);
    auVar75 = vaddps_avx512vl(auVar75,auVar76);
    auVar76 = vmulps_avx512vl(auVar87,auVar74);
    auVar76 = vfnmadd231ps_avx512vl(auVar76,auVar75,auVar85);
    auVar68 = vmulps_avx512vl(auVar68,auVar74);
    auVar68 = vfnmadd213ps_avx512vl(auVar118,auVar75,auVar68);
    auVar69 = vmulps_avx512vl(auVar69,auVar74);
    auVar69 = vfnmadd213ps_avx512vl(auVar79,auVar75,auVar69);
    auVar79 = vmulps_avx512vl(auVar66,auVar74);
    auVar66 = vfnmadd231ps_avx512vl(auVar79,auVar75,auVar64);
    auVar79 = vmulps_avx512vl(auVar73,auVar74);
    auVar73 = vfnmadd231ps_avx512vl(auVar79,auVar75,auVar80);
    auVar79 = vmulps_avx512vl(auVar70,auVar74);
    auVar70 = vfnmadd213ps_avx512vl(auVar196,auVar75,auVar79);
    auVar79 = vmulps_avx512vl(auVar65,auVar74);
    auVar77 = vfnmadd213ps_avx512vl(auVar81,auVar75,auVar79);
    auVar81 = vmulps_avx512vl(auVar72,auVar74);
    auVar71 = vfnmadd231ps_avx512vl(auVar81,auVar71,auVar75);
    auVar79 = vminps_avx(auVar76,auVar68);
    auVar81 = vmaxps_avx(auVar76,auVar68);
    auVar64 = vminps_avx(auVar69,auVar66);
    auVar64 = vminps_avx(auVar79,auVar64);
    auVar79 = vmaxps_avx(auVar69,auVar66);
    auVar81 = vmaxps_avx(auVar81,auVar79);
    auVar80 = vminps_avx(auVar73,auVar70);
    auVar79 = vmaxps_avx(auVar73,auVar70);
    auVar65 = vminps_avx(auVar77,auVar71);
    auVar80 = vminps_avx(auVar80,auVar65);
    auVar80 = vminps_avx(auVar64,auVar80);
    auVar64 = vmaxps_avx(auVar77,auVar71);
    auVar79 = vmaxps_avx(auVar79,auVar64);
    auVar81 = vmaxps_avx(auVar81,auVar79);
    uVar13 = vcmpps_avx512vl(auVar81,auVar67,5);
    uVar14 = vcmpps_avx512vl(auVar80,local_1c0,2);
    bVar21 = bVar21 & (byte)uVar13 & (byte)uVar14;
    if (bVar21 != 0) {
      auStack_460[uVar23] = (uint)bVar21;
      uVar13 = vmovlps_avx(auVar40);
      (&uStack_260)[uVar23] = uVar13;
      uVar28 = vmovlps_avx(auVar108);
      auStack_1a0[uVar23] = uVar28;
      uVar23 = (ulong)((int)uVar23 + 1);
    }
    auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar237 = ZEXT1664(auVar40);
    auVar81 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar238 = ZEXT3264(auVar81);
    auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
    auVar239 = ZEXT1664(auVar40);
    auVar240 = ZEXT3264(_DAT_01fb9fe0);
  }
LAB_01817ca7:
  do {
    do {
      do {
        auVar51 = SUB6416(ZEXT464(0xb8d1b717),0);
        if ((int)uVar23 == 0) {
          if (bVar31) goto LAB_01818c09;
          uVar103 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar20._4_4_ = uVar103;
          auVar20._0_4_ = uVar103;
          auVar20._8_4_ = uVar103;
          auVar20._12_4_ = uVar103;
          uVar13 = vcmpps_avx512vl(local_3c0,auVar20,2);
          uVar29 = (ulong)((uint)uVar30 & (uint)uVar13);
          goto LAB_01816fe1;
        }
        uVar22 = (int)uVar23 - 1;
        uVar24 = (ulong)uVar22;
        uVar4 = auStack_460[uVar24];
        auVar108._8_8_ = 0;
        auVar108._0_8_ = auStack_1a0[uVar24];
        uVar28 = 0;
        for (uVar27 = (ulong)uVar4; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x8000000000000000) {
          uVar28 = uVar28 + 1;
        }
        uVar26 = uVar4 - 1 & uVar4;
        bVar34 = uVar26 == 0;
        auStack_460[uVar24] = uVar26;
        if (bVar34) {
          uVar23 = (ulong)uVar22;
        }
        auVar99._8_8_ = 0;
        auVar99._0_8_ = uVar28;
        auVar40 = vpunpcklqdq_avx(auVar99,ZEXT416((int)uVar28 + 1));
        auVar40 = vcvtqq2ps_avx512vl(auVar40);
        auVar40 = vmulps_avx512vl(auVar40,auVar239._0_16_);
        uVar103 = *(undefined4 *)((long)&uStack_260 + uVar24 * 8 + 4);
        auVar15._4_4_ = uVar103;
        auVar15._0_4_ = uVar103;
        auVar15._8_4_ = uVar103;
        auVar15._12_4_ = uVar103;
        auVar50 = vmulps_avx512vl(auVar40,auVar15);
        auVar45 = auVar242._0_16_;
        auVar40 = vsubps_avx512vl(auVar45,auVar40);
        uVar103 = *(undefined4 *)(&uStack_260 + uVar24);
        auVar16._4_4_ = uVar103;
        auVar16._0_4_ = uVar103;
        auVar16._8_4_ = uVar103;
        auVar16._12_4_ = uVar103;
        auVar40 = vfmadd231ps_avx512vl(auVar50,auVar40,auVar16);
        auVar50 = vmovshdup_avx(auVar40);
        fVar213 = auVar50._0_4_ - auVar40._0_4_;
        vucomiss_avx512f(ZEXT416((uint)fVar213));
        if (uVar4 == 0 || bVar34) goto LAB_01817745;
        auVar50 = vshufps_avx(auVar108,auVar108,0x50);
        vucomiss_avx512f(ZEXT416((uint)fVar213));
        bVar32 = (uint)uVar23 < 4;
        uVar22 = (uint)uVar23 - 4;
        bVar35 = uVar22 == 0;
        bVar33 = (POPCOUNT(uVar22 & 0xff) & 1U) == 0;
        auVar49 = vsubps_avx512vl(auVar45,auVar50);
        fVar198 = auVar50._0_4_;
        auVar143._0_4_ = fVar198 * fVar119;
        fVar209 = auVar50._4_4_;
        auVar143._4_4_ = fVar209 * fVar120;
        fVar211 = auVar50._8_4_;
        auVar143._8_4_ = fVar211 * fVar119;
        fVar208 = auVar50._12_4_;
        auVar143._12_4_ = fVar208 * fVar120;
        auVar156._0_4_ = fVar198 * fVar121;
        auVar156._4_4_ = fVar209 * fVar131;
        auVar156._8_4_ = fVar211 * fVar121;
        auVar156._12_4_ = fVar208 * fVar131;
        auVar167._0_4_ = fVar198 * fVar137;
        auVar167._4_4_ = fVar209 * fVar138;
        auVar167._8_4_ = fVar211 * fVar137;
        auVar167._12_4_ = fVar208 * fVar138;
        auVar127._0_4_ = fVar198 * fVar139;
        auVar127._4_4_ = fVar209 * fVar197;
        auVar127._8_4_ = fVar211 * fVar139;
        auVar127._12_4_ = fVar208 * fVar197;
        auVar50 = vfmadd231ps_fma(auVar143,auVar49,auVar166);
        auVar43 = vfmadd231ps_fma(auVar156,auVar49,auVar41);
        auVar44 = vfmadd231ps_fma(auVar167,auVar49,auVar42);
        auVar49 = vfmadd231ps_fma(auVar127,auVar49,auVar183);
        auVar72._16_16_ = auVar50;
        auVar72._0_16_ = auVar50;
        auVar73._16_16_ = auVar43;
        auVar73._0_16_ = auVar43;
        auVar75._16_16_ = auVar44;
        auVar75._0_16_ = auVar44;
        auVar79 = vpermps_avx512vl(auVar240._0_32_,ZEXT1632(auVar40));
        auVar81 = vsubps_avx(auVar73,auVar72);
        auVar43 = vfmadd213ps_fma(auVar81,auVar79,auVar72);
        auVar81 = vsubps_avx(auVar75,auVar73);
        auVar59 = vfmadd213ps_fma(auVar81,auVar79,auVar73);
        auVar50 = vsubps_avx(auVar49,auVar44);
        auVar74._16_16_ = auVar50;
        auVar74._0_16_ = auVar50;
        auVar50 = vfmadd213ps_fma(auVar74,auVar79,auVar75);
        auVar81 = vsubps_avx(ZEXT1632(auVar59),ZEXT1632(auVar43));
        auVar43 = vfmadd213ps_fma(auVar81,auVar79,ZEXT1632(auVar43));
        auVar81 = vsubps_avx(ZEXT1632(auVar50),ZEXT1632(auVar59));
        auVar50 = vfmadd213ps_fma(auVar81,auVar79,ZEXT1632(auVar59));
        auVar81 = vsubps_avx(ZEXT1632(auVar50),ZEXT1632(auVar43));
        auVar132 = vfmadd231ps_fma(ZEXT1632(auVar43),auVar81,auVar79);
        auVar81 = vmulps_avx512vl(auVar81,auVar238._0_32_);
        auVar71._16_16_ = auVar81._16_16_;
        auVar50 = vmulss_avx512f(ZEXT416((uint)fVar213),SUB6416(ZEXT464(0x3eaaaaab),0));
        fVar198 = auVar50._0_4_;
        auVar168._0_8_ =
             CONCAT44(auVar132._4_4_ + fVar198 * auVar81._4_4_,
                      auVar132._0_4_ + fVar198 * auVar81._0_4_);
        auVar168._8_4_ = auVar132._8_4_ + fVar198 * auVar81._8_4_;
        auVar168._12_4_ = auVar132._12_4_ + fVar198 * auVar81._12_4_;
        auVar144._0_4_ = fVar198 * auVar81._16_4_;
        auVar144._4_4_ = fVar198 * auVar81._20_4_;
        auVar144._8_4_ = fVar198 * auVar81._24_4_;
        auVar144._12_4_ = fVar198 * auVar81._28_4_;
        auVar57 = vsubps_avx((undefined1  [16])0x0,auVar144);
        auVar59 = vshufpd_avx(auVar132,auVar132,3);
        auVar63 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
        auVar50 = vsubps_avx(auVar59,auVar132);
        auVar43 = vsubps_avx(auVar63,(undefined1  [16])0x0);
        auVar184._0_4_ = auVar50._0_4_ + auVar43._0_4_;
        auVar184._4_4_ = auVar50._4_4_ + auVar43._4_4_;
        auVar184._8_4_ = auVar50._8_4_ + auVar43._8_4_;
        auVar184._12_4_ = auVar50._12_4_ + auVar43._12_4_;
        auVar50 = vshufps_avx(auVar132,auVar132,0xb1);
        auVar43 = vshufps_avx(auVar168,auVar168,0xb1);
        auVar44 = vshufps_avx(auVar57,auVar57,0xb1);
        auVar49 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
        auVar231._4_4_ = auVar184._0_4_;
        auVar231._0_4_ = auVar184._0_4_;
        auVar231._8_4_ = auVar184._0_4_;
        auVar231._12_4_ = auVar184._0_4_;
        auVar54 = vshufps_avx(auVar184,auVar184,0x55);
        fVar198 = auVar54._0_4_;
        auVar194._0_4_ = auVar50._0_4_ * fVar198;
        fVar209 = auVar54._4_4_;
        auVar194._4_4_ = auVar50._4_4_ * fVar209;
        fVar211 = auVar54._8_4_;
        auVar194._8_4_ = auVar50._8_4_ * fVar211;
        fVar208 = auVar54._12_4_;
        auVar194._12_4_ = auVar50._12_4_ * fVar208;
        auVar200._0_4_ = auVar43._0_4_ * fVar198;
        auVar200._4_4_ = auVar43._4_4_ * fVar209;
        auVar200._8_4_ = auVar43._8_4_ * fVar211;
        auVar200._12_4_ = auVar43._12_4_ * fVar208;
        auVar216._0_4_ = auVar44._0_4_ * fVar198;
        auVar216._4_4_ = auVar44._4_4_ * fVar209;
        auVar216._8_4_ = auVar44._8_4_ * fVar211;
        auVar216._12_4_ = auVar44._12_4_ * fVar208;
        auVar185._0_4_ = auVar49._0_4_ * fVar198;
        auVar185._4_4_ = auVar49._4_4_ * fVar209;
        auVar185._8_4_ = auVar49._8_4_ * fVar211;
        auVar185._12_4_ = auVar49._12_4_ * fVar208;
        auVar50 = vfmadd231ps_fma(auVar194,auVar231,auVar132);
        auVar43 = vfmadd231ps_fma(auVar200,auVar231,auVar168);
        auVar56 = vfmadd231ps_fma(auVar216,auVar231,auVar57);
        auVar62 = vfmadd231ps_fma(auVar185,(undefined1  [16])0x0,auVar231);
        auVar54 = vshufpd_avx(auVar50,auVar50,1);
        auVar55 = vshufpd_avx(auVar43,auVar43,1);
        auVar52 = vshufpd_avx512vl(auVar56,auVar56,1);
        auVar53 = vshufpd_avx512vl(auVar62,auVar62,1);
        auVar44 = vminss_avx(auVar50,auVar43);
        auVar50 = vmaxss_avx(auVar43,auVar50);
        auVar49 = vminss_avx(auVar56,auVar62);
        auVar43 = vmaxss_avx(auVar62,auVar56);
        auVar44 = vminss_avx(auVar44,auVar49);
        auVar50 = vmaxss_avx(auVar43,auVar50);
        auVar49 = vminss_avx(auVar54,auVar55);
        auVar43 = vmaxss_avx(auVar55,auVar54);
        auVar54 = vminss_avx512f(auVar52,auVar53);
        auVar55 = vmaxss_avx512f(auVar53,auVar52);
        vmaxss_avx(auVar55,auVar43);
        auVar43 = vminss_avx512f(auVar49,auVar54);
        vucomiss_avx512f(auVar44);
        if ((!bVar32 && !bVar35) &&
           (auVar49 = vucomiss_avx512f(auVar51), bVar36 = bVar35, !bVar32 && !bVar35)) break;
        auVar49 = vucomiss_avx512f(auVar51);
        auVar54 = vucomiss_avx512f(auVar43);
        auVar50 = vucomiss_avx512f(auVar51);
        bVar36 = bVar32 || bVar35;
        bVar33 = bVar32 || bVar35;
        if (!bVar32 && !bVar35) break;
        uVar13 = vcmpps_avx512vl(auVar44,auVar54,5);
        uVar14 = vcmpps_avx512vl(auVar43,auVar54,5);
        bVar21 = (byte)uVar13 & (byte)uVar14;
        bVar9 = (bVar21 & 1) == 0;
        bVar36 = (!bVar32 && !bVar35) && bVar9;
        bVar33 = (!bVar32 && !bVar35) && (bVar21 & 1) == 0;
      } while ((bVar32 || bVar35) || !bVar9);
      auVar55 = auVar243._0_16_;
      vcmpss_avx512f(auVar44,auVar55,1);
      uVar13 = vcmpss_avx512f(auVar50,auVar55,1);
      bVar35 = (bool)((byte)uVar13 & 1);
      auVar71._0_16_ = auVar244._0_16_;
      auVar85._4_28_ = auVar71._4_28_;
      auVar85._0_4_ = (float)((uint)bVar35 * -0x40800000 + (uint)!bVar35 * auVar244._0_4_);
      vucomiss_avx512f(auVar85._0_16_);
      bVar33 = (bool)(!bVar36 | bVar33);
      bVar36 = bVar33 == false;
      auVar87._16_16_ = auVar71._16_16_;
      auVar87._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
      auVar86._4_28_ = auVar87._4_28_;
      auVar86._0_4_ = (uint)bVar33 * auVar243._0_4_ + (uint)!bVar33 * 0x7f800000;
      auVar54 = auVar86._0_16_;
      auVar89._16_16_ = auVar71._16_16_;
      auVar89._0_16_ = SUB6416(ZEXT464(0xff800000),0);
      auVar88._4_28_ = auVar89._4_28_;
      auVar88._0_4_ = (uint)bVar33 * auVar243._0_4_ + (uint)!bVar33 * -0x800000;
      auVar51 = auVar88._0_16_;
      uVar13 = vcmpss_avx512f(auVar43,auVar55,1);
      bVar35 = (bool)((byte)uVar13 & 1);
      auVar91._16_16_ = auVar71._16_16_;
      auVar91._0_16_ = auVar244._0_16_;
      auVar90._4_28_ = auVar91._4_28_;
      auVar90._0_4_ = (float)((uint)bVar35 * -0x40800000 + (uint)!bVar35 * auVar244._0_4_);
      vucomiss_avx512f(auVar90._0_16_);
      if ((bVar33) || (bVar36)) {
        auVar43 = vucomiss_avx512f(auVar44);
        if ((bVar33) || (bVar36)) {
          auVar19._8_4_ = 0x80000000;
          auVar19._0_8_ = 0x8000000080000000;
          auVar19._12_4_ = 0x80000000;
          auVar56 = vxorps_avx512vl(auVar44,auVar19);
          auVar43 = vsubss_avx512f(auVar43,auVar44);
          auVar43 = vdivss_avx512f(auVar56,auVar43);
          auVar44 = vsubss_avx512f(ZEXT416(0x3f800000),auVar43);
          auVar44 = vfmadd213ss_avx512f(auVar44,auVar55,auVar43);
          auVar43 = auVar44;
        }
        else {
          auVar43 = vxorps_avx512vl(auVar43,auVar43);
          vucomiss_avx512f(auVar43);
          auVar44 = ZEXT416(0x3f800000);
          if ((bVar33) || (bVar36)) {
            auVar44 = SUB6416(ZEXT464(0xff800000),0);
            auVar43 = SUB6416(ZEXT464(0x7f800000),0);
          }
        }
        auVar54 = vminss_avx512f(auVar54,auVar43);
        auVar51 = vmaxss_avx(auVar44,auVar51);
      }
      auVar244 = ZEXT464(0x3f800000);
      uVar13 = vcmpss_avx512f(auVar49,auVar55,1);
      bVar33 = (bool)((byte)uVar13 & 1);
      auVar43 = auVar244._0_16_;
      fVar198 = (float)((uint)bVar33 * -0x40800000 + (uint)!bVar33 * 0x3f800000);
      if ((auVar85._0_4_ != fVar198) || (NAN(auVar85._0_4_) || NAN(fVar198))) {
        fVar211 = auVar49._0_4_;
        fVar209 = auVar50._0_4_;
        if ((fVar211 != fVar209) || (NAN(fVar211) || NAN(fVar209))) {
          auVar18._8_4_ = 0x80000000;
          auVar18._0_8_ = 0x8000000080000000;
          auVar18._12_4_ = 0x80000000;
          auVar50 = vxorps_avx512vl(auVar50,auVar18);
          auVar186._0_4_ = auVar50._0_4_ / (fVar211 - fVar209);
          auVar186._4_12_ = auVar50._4_12_;
          auVar50 = vsubss_avx512f(auVar43,auVar186);
          auVar50 = vfmadd213ss_avx512f(auVar50,auVar55,auVar186);
          auVar44 = auVar50;
        }
        else if ((fVar209 != 0.0) || (auVar50 = auVar43, auVar44 = ZEXT816(0) << 0x40, NAN(fVar209))
                ) {
          auVar50 = SUB6416(ZEXT464(0xff800000),0);
          auVar44 = SUB6416(ZEXT464(0x7f800000),0);
        }
        auVar54 = vminss_avx(auVar54,auVar44);
        auVar51 = vmaxss_avx(auVar50,auVar51);
      }
      bVar33 = auVar90._0_4_ != fVar198;
      auVar50 = vminss_avx512f(auVar54,auVar43);
      auVar93._16_16_ = auVar71._16_16_;
      auVar93._0_16_ = auVar54;
      auVar92._4_28_ = auVar93._4_28_;
      auVar92._0_4_ = (uint)bVar33 * auVar50._0_4_ + (uint)!bVar33 * auVar54._0_4_;
      auVar50 = vmaxss_avx512f(auVar43,auVar51);
      auVar95._16_16_ = auVar71._16_16_;
      auVar95._0_16_ = auVar51;
      auVar94._4_28_ = auVar95._4_28_;
      auVar94._0_4_ = (uint)bVar33 * auVar50._0_4_ + (uint)!bVar33 * auVar51._0_4_;
      auVar51 = vmaxss_avx512f(auVar55,auVar92._0_16_);
      auVar50 = vminss_avx512f(auVar94._0_16_,auVar43);
    } while (auVar50._0_4_ < auVar51._0_4_);
    auVar49 = vmaxss_avx512f(auVar55,ZEXT416((uint)(auVar51._0_4_ + -0.1)));
    auVar56 = vminss_avx512f(ZEXT416((uint)(auVar50._0_4_ + 0.1)),auVar43);
    auVar128._0_8_ = auVar132._0_8_;
    auVar128._8_8_ = auVar128._0_8_;
    auVar201._8_8_ = auVar168._0_8_;
    auVar201._0_8_ = auVar168._0_8_;
    auVar217._8_8_ = auVar57._0_8_;
    auVar217._0_8_ = auVar57._0_8_;
    auVar51 = vshufpd_avx(auVar168,auVar168,3);
    auVar50 = vshufpd_avx(auVar57,auVar57,3);
    auVar44 = vshufps_avx(auVar49,auVar56,0);
    auVar55 = vsubps_avx512vl(auVar45,auVar44);
    fVar198 = auVar44._0_4_;
    auVar157._0_4_ = fVar198 * auVar59._0_4_;
    fVar209 = auVar44._4_4_;
    auVar157._4_4_ = fVar209 * auVar59._4_4_;
    fVar211 = auVar44._8_4_;
    auVar157._8_4_ = fVar211 * auVar59._8_4_;
    fVar208 = auVar44._12_4_;
    auVar157._12_4_ = fVar208 * auVar59._12_4_;
    auVar169._0_4_ = fVar198 * auVar51._0_4_;
    auVar169._4_4_ = fVar209 * auVar51._4_4_;
    auVar169._8_4_ = fVar211 * auVar51._8_4_;
    auVar169._12_4_ = fVar208 * auVar51._12_4_;
    auVar233._0_4_ = auVar50._0_4_ * fVar198;
    auVar233._4_4_ = auVar50._4_4_ * fVar209;
    auVar233._8_4_ = auVar50._8_4_ * fVar211;
    auVar233._12_4_ = auVar50._12_4_ * fVar208;
    auVar145._0_4_ = fVar198 * auVar63._0_4_;
    auVar145._4_4_ = fVar209 * auVar63._4_4_;
    auVar145._8_4_ = fVar211 * auVar63._8_4_;
    auVar145._12_4_ = fVar208 * auVar63._12_4_;
    auVar59 = vfmadd231ps_fma(auVar157,auVar55,auVar128);
    auVar63 = vfmadd231ps_fma(auVar169,auVar55,auVar201);
    auVar54 = vfmadd231ps_fma(auVar233,auVar55,auVar217);
    auVar55 = vfmadd231ps_fma(auVar145,auVar55,ZEXT816(0));
    auVar50 = vsubss_avx512f(auVar43,auVar49);
    auVar51 = vmovshdup_avx(auVar108);
    auVar132 = vfmadd231ss_fma(ZEXT416((uint)(auVar51._0_4_ * auVar49._0_4_)),auVar108,auVar50);
    auVar50 = vsubss_avx512f(auVar43,auVar56);
    auVar52 = vfmadd231ss_fma(ZEXT416((uint)(auVar51._0_4_ * auVar56._0_4_)),auVar108,auVar50);
    auVar57 = vdivss_avx512f(auVar43,ZEXT416((uint)fVar213));
    auVar51 = vsubps_avx(auVar63,auVar59);
    auVar56 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar44 = vmulps_avx512vl(auVar51,auVar56);
    auVar51 = vsubps_avx(auVar54,auVar63);
    auVar49 = vmulps_avx512vl(auVar51,auVar56);
    auVar51 = vsubps_avx(auVar55,auVar54);
    auVar51 = vmulps_avx512vl(auVar51,auVar56);
    auVar50 = vminps_avx(auVar49,auVar51);
    auVar51 = vmaxps_avx(auVar49,auVar51);
    auVar50 = vminps_avx(auVar44,auVar50);
    auVar51 = vmaxps_avx(auVar44,auVar51);
    auVar44 = vshufpd_avx(auVar50,auVar50,3);
    auVar49 = vshufpd_avx(auVar51,auVar51,3);
    auVar50 = vminps_avx(auVar50,auVar44);
    auVar51 = vmaxps_avx(auVar51,auVar49);
    fVar213 = auVar57._0_4_;
    auVar187._0_4_ = auVar50._0_4_ * fVar213;
    auVar187._4_4_ = auVar50._4_4_ * fVar213;
    auVar187._8_4_ = auVar50._8_4_ * fVar213;
    auVar187._12_4_ = auVar50._12_4_ * fVar213;
    auVar175._0_4_ = fVar213 * auVar51._0_4_;
    auVar175._4_4_ = fVar213 * auVar51._4_4_;
    auVar175._8_4_ = fVar213 * auVar51._8_4_;
    auVar175._12_4_ = fVar213 * auVar51._12_4_;
    auVar57 = vdivss_avx512f(auVar43,ZEXT416((uint)(auVar52._0_4_ - auVar132._0_4_)));
    auVar51 = vshufpd_avx(auVar59,auVar59,3);
    auVar50 = vshufpd_avx(auVar63,auVar63,3);
    auVar44 = vshufpd_avx(auVar54,auVar54,3);
    auVar49 = vshufpd_avx(auVar55,auVar55,3);
    auVar51 = vsubps_avx(auVar51,auVar59);
    auVar59 = vsubps_avx(auVar50,auVar63);
    auVar63 = vsubps_avx(auVar44,auVar54);
    auVar49 = vsubps_avx(auVar49,auVar55);
    auVar50 = vminps_avx(auVar51,auVar59);
    auVar51 = vmaxps_avx(auVar51,auVar59);
    auVar44 = vminps_avx(auVar63,auVar49);
    auVar44 = vminps_avx(auVar50,auVar44);
    auVar50 = vmaxps_avx(auVar63,auVar49);
    auVar51 = vmaxps_avx(auVar51,auVar50);
    fVar213 = auVar57._0_4_;
    auVar218._0_4_ = fVar213 * auVar44._0_4_;
    auVar218._4_4_ = fVar213 * auVar44._4_4_;
    auVar218._8_4_ = fVar213 * auVar44._8_4_;
    auVar218._12_4_ = fVar213 * auVar44._12_4_;
    auVar202._0_4_ = fVar213 * auVar51._0_4_;
    auVar202._4_4_ = fVar213 * auVar51._4_4_;
    auVar202._8_4_ = fVar213 * auVar51._8_4_;
    auVar202._12_4_ = fVar213 * auVar51._12_4_;
    auVar49 = vinsertps_avx(auVar40,auVar132,0x10);
    auVar53 = vpermt2ps_avx512vl(auVar40,_DAT_01fb9f90,auVar52);
    auVar109._0_4_ = auVar49._0_4_ + auVar53._0_4_;
    auVar109._4_4_ = auVar49._4_4_ + auVar53._4_4_;
    auVar109._8_4_ = auVar49._8_4_ + auVar53._8_4_;
    auVar109._12_4_ = auVar49._12_4_ + auVar53._12_4_;
    auVar57 = vmulps_avx512vl(auVar109,auVar237._0_16_);
    auVar50 = vshufps_avx(auVar57,auVar57,0x54);
    uVar103 = auVar57._0_4_;
    auVar115._4_4_ = uVar103;
    auVar115._0_4_ = uVar103;
    auVar115._8_4_ = uVar103;
    auVar115._12_4_ = uVar103;
    auVar44 = vfmadd213ps_fma(local_270,auVar115,auVar37);
    auVar59 = vfmadd213ps_fma(local_280,auVar115,auVar38);
    auVar63 = vfmadd213ps_fma(local_290,auVar115,auVar12);
    auVar51 = vsubps_avx(auVar59,auVar44);
    auVar44 = vfmadd213ps_fma(auVar51,auVar115,auVar44);
    auVar51 = vsubps_avx(auVar63,auVar59);
    auVar51 = vfmadd213ps_fma(auVar51,auVar115,auVar59);
    auVar51 = vsubps_avx(auVar51,auVar44);
    auVar44 = vfmadd231ps_fma(auVar44,auVar51,auVar115);
    auVar54 = vmulps_avx512vl(auVar51,auVar56);
    auVar226._8_8_ = auVar44._0_8_;
    auVar226._0_8_ = auVar44._0_8_;
    auVar51 = vshufpd_avx(auVar44,auVar44,3);
    auVar44 = vshufps_avx(auVar57,auVar57,0x55);
    auVar59 = vsubps_avx(auVar51,auVar226);
    auVar63 = vfmadd231ps_fma(auVar226,auVar44,auVar59);
    auVar234._8_8_ = auVar54._0_8_;
    auVar234._0_8_ = auVar54._0_8_;
    auVar51 = vshufpd_avx(auVar54,auVar54,3);
    auVar51 = vsubps_avx512vl(auVar51,auVar234);
    auVar51 = vfmadd213ps_avx512vl(auVar51,auVar44,auVar234);
    auVar44 = vxorps_avx512vl(auVar59,auVar245._0_16_);
    auVar54 = vmovshdup_avx512vl(auVar51);
    auVar55 = vxorps_avx512vl(auVar54,auVar245._0_16_);
    auVar56 = vmovshdup_avx512vl(auVar59);
    auVar55 = vpermt2ps_avx512vl(auVar55,ZEXT416(5),auVar59);
    auVar58 = vxorps_avx512vl(ZEXT416(5),ZEXT416(5));
    auVar243 = ZEXT1664(auVar58);
    auVar59 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar54._0_4_ * auVar59._0_4_)),auVar51,auVar56);
    auVar44 = vpermt2ps_avx512vl(auVar51,SUB6416(ZEXT464(4),0),auVar44);
    auVar146._0_4_ = auVar59._0_4_;
    auVar146._4_4_ = auVar146._0_4_;
    auVar146._8_4_ = auVar146._0_4_;
    auVar146._12_4_ = auVar146._0_4_;
    auVar51 = vdivps_avx(auVar55,auVar146);
    auVar60 = vdivps_avx512vl(auVar44,auVar146);
    fVar213 = auVar63._0_4_;
    auVar44 = vshufps_avx(auVar63,auVar63,0x55);
    auVar227._0_4_ = fVar213 * auVar51._0_4_ + auVar44._0_4_ * auVar60._0_4_;
    auVar227._4_4_ = fVar213 * auVar51._4_4_ + auVar44._4_4_ * auVar60._4_4_;
    auVar227._8_4_ = fVar213 * auVar51._8_4_ + auVar44._8_4_ * auVar60._8_4_;
    auVar227._12_4_ = fVar213 * auVar51._12_4_ + auVar44._12_4_ * auVar60._12_4_;
    auVar56 = vsubps_avx(auVar50,auVar227);
    auVar44 = vmovshdup_avx(auVar51);
    auVar50 = vinsertps_avx(auVar187,auVar218,0x1c);
    auVar235._0_4_ = auVar44._0_4_ * auVar50._0_4_;
    auVar235._4_4_ = auVar44._4_4_ * auVar50._4_4_;
    auVar235._8_4_ = auVar44._8_4_ * auVar50._8_4_;
    auVar235._12_4_ = auVar44._12_4_ * auVar50._12_4_;
    auVar62 = vinsertps_avx512f(auVar175,auVar202,0x1c);
    auVar44 = vmulps_avx512vl(auVar44,auVar62);
    auVar55 = vminps_avx512vl(auVar235,auVar44);
    auVar63 = vmaxps_avx(auVar44,auVar235);
    auVar54 = vmovshdup_avx(auVar60);
    auVar44 = vinsertps_avx(auVar218,auVar187,0x4c);
    auVar219._0_4_ = auVar54._0_4_ * auVar44._0_4_;
    auVar219._4_4_ = auVar54._4_4_ * auVar44._4_4_;
    auVar219._8_4_ = auVar54._8_4_ * auVar44._8_4_;
    auVar219._12_4_ = auVar54._12_4_ * auVar44._12_4_;
    auVar59 = vinsertps_avx(auVar202,auVar175,0x4c);
    auVar203._0_4_ = auVar54._0_4_ * auVar59._0_4_;
    auVar203._4_4_ = auVar54._4_4_ * auVar59._4_4_;
    auVar203._8_4_ = auVar54._8_4_ * auVar59._8_4_;
    auVar203._12_4_ = auVar54._12_4_ * auVar59._12_4_;
    auVar54 = vminps_avx(auVar219,auVar203);
    auVar55 = vaddps_avx512vl(auVar55,auVar54);
    auVar54 = vmaxps_avx(auVar203,auVar219);
    auVar204._0_4_ = auVar63._0_4_ + auVar54._0_4_;
    auVar204._4_4_ = auVar63._4_4_ + auVar54._4_4_;
    auVar204._8_4_ = auVar63._8_4_ + auVar54._8_4_;
    auVar204._12_4_ = auVar63._12_4_ + auVar54._12_4_;
    auVar220._8_8_ = 0x3f80000000000000;
    auVar220._0_8_ = 0x3f80000000000000;
    auVar63 = vsubps_avx(auVar220,auVar204);
    auVar54 = vsubps_avx(auVar220,auVar55);
    auVar55 = vsubps_avx(auVar49,auVar57);
    auVar57 = vsubps_avx(auVar53,auVar57);
    fVar208 = auVar55._0_4_;
    auVar236._0_4_ = fVar208 * auVar63._0_4_;
    fVar210 = auVar55._4_4_;
    auVar236._4_4_ = fVar210 * auVar63._4_4_;
    fVar212 = auVar55._8_4_;
    auVar236._8_4_ = fVar212 * auVar63._8_4_;
    fVar214 = auVar55._12_4_;
    auVar236._12_4_ = fVar214 * auVar63._12_4_;
    auVar61 = vbroadcastss_avx512vl(auVar51);
    auVar50 = vmulps_avx512vl(auVar61,auVar50);
    auVar62 = vmulps_avx512vl(auVar61,auVar62);
    auVar61 = vminps_avx512vl(auVar50,auVar62);
    auVar62 = vmaxps_avx512vl(auVar62,auVar50);
    auVar50 = vbroadcastss_avx512vl(auVar60);
    auVar44 = vmulps_avx512vl(auVar50,auVar44);
    auVar50 = vmulps_avx512vl(auVar50,auVar59);
    auVar59 = vminps_avx512vl(auVar44,auVar50);
    auVar59 = vaddps_avx512vl(auVar61,auVar59);
    auVar55 = vmulps_avx512vl(auVar55,auVar54);
    fVar213 = auVar57._0_4_;
    auVar205._0_4_ = fVar213 * auVar63._0_4_;
    fVar198 = auVar57._4_4_;
    auVar205._4_4_ = fVar198 * auVar63._4_4_;
    fVar209 = auVar57._8_4_;
    auVar205._8_4_ = fVar209 * auVar63._8_4_;
    fVar211 = auVar57._12_4_;
    auVar205._12_4_ = fVar211 * auVar63._12_4_;
    auVar221._0_4_ = fVar213 * auVar54._0_4_;
    auVar221._4_4_ = fVar198 * auVar54._4_4_;
    auVar221._8_4_ = fVar209 * auVar54._8_4_;
    auVar221._12_4_ = fVar211 * auVar54._12_4_;
    auVar50 = vmaxps_avx(auVar50,auVar44);
    auVar176._0_4_ = auVar62._0_4_ + auVar50._0_4_;
    auVar176._4_4_ = auVar62._4_4_ + auVar50._4_4_;
    auVar176._8_4_ = auVar62._8_4_ + auVar50._8_4_;
    auVar176._12_4_ = auVar62._12_4_ + auVar50._12_4_;
    auVar188._8_8_ = 0x3f800000;
    auVar188._0_8_ = 0x3f800000;
    auVar50 = vsubps_avx(auVar188,auVar176);
    auVar44 = vsubps_avx512vl(auVar188,auVar59);
    auVar232._0_4_ = fVar208 * auVar50._0_4_;
    auVar232._4_4_ = fVar210 * auVar50._4_4_;
    auVar232._8_4_ = fVar212 * auVar50._8_4_;
    auVar232._12_4_ = fVar214 * auVar50._12_4_;
    auVar228._0_4_ = fVar208 * auVar44._0_4_;
    auVar228._4_4_ = fVar210 * auVar44._4_4_;
    auVar228._8_4_ = fVar212 * auVar44._8_4_;
    auVar228._12_4_ = fVar214 * auVar44._12_4_;
    auVar177._0_4_ = fVar213 * auVar50._0_4_;
    auVar177._4_4_ = fVar198 * auVar50._4_4_;
    auVar177._8_4_ = fVar209 * auVar50._8_4_;
    auVar177._12_4_ = fVar211 * auVar50._12_4_;
    auVar189._0_4_ = fVar213 * auVar44._0_4_;
    auVar189._4_4_ = fVar198 * auVar44._4_4_;
    auVar189._8_4_ = fVar209 * auVar44._8_4_;
    auVar189._12_4_ = fVar211 * auVar44._12_4_;
    auVar50 = vminps_avx(auVar232,auVar228);
    auVar44 = vminps_avx512vl(auVar177,auVar189);
    auVar59 = vminps_avx512vl(auVar50,auVar44);
    auVar50 = vmaxps_avx(auVar228,auVar232);
    auVar44 = vmaxps_avx(auVar189,auVar177);
    auVar44 = vmaxps_avx(auVar44,auVar50);
    auVar63 = vminps_avx512vl(auVar236,auVar55);
    auVar50 = vminps_avx(auVar205,auVar221);
    auVar50 = vminps_avx(auVar63,auVar50);
    auVar50 = vhaddps_avx(auVar59,auVar50);
    auVar63 = vmaxps_avx512vl(auVar55,auVar236);
    auVar59 = vmaxps_avx(auVar221,auVar205);
    auVar59 = vmaxps_avx(auVar59,auVar63);
    auVar44 = vhaddps_avx(auVar44,auVar59);
    auVar50 = vshufps_avx(auVar50,auVar50,0xe8);
    auVar44 = vshufps_avx(auVar44,auVar44,0xe8);
    auVar178._0_4_ = auVar50._0_4_ + auVar56._0_4_;
    auVar178._4_4_ = auVar50._4_4_ + auVar56._4_4_;
    auVar178._8_4_ = auVar50._8_4_ + auVar56._8_4_;
    auVar178._12_4_ = auVar50._12_4_ + auVar56._12_4_;
    auVar190._0_4_ = auVar44._0_4_ + auVar56._0_4_;
    auVar190._4_4_ = auVar44._4_4_ + auVar56._4_4_;
    auVar190._8_4_ = auVar44._8_4_ + auVar56._8_4_;
    auVar190._12_4_ = auVar44._12_4_ + auVar56._12_4_;
    auVar50 = vmaxps_avx(auVar49,auVar178);
    auVar44 = vminps_avx(auVar190,auVar53);
    uVar28 = vcmpps_avx512vl(auVar44,auVar50,1);
  } while ((uVar28 & 3) != 0);
  uVar28 = vcmpps_avx512vl(auVar190,auVar53,1);
  uVar13 = vcmpps_avx512vl(auVar40,auVar178,1);
  if (((ushort)uVar13 & (ushort)uVar28 & 1) == 0) {
    bVar21 = 0;
  }
  else {
    auVar50 = vmovshdup_avx(auVar178);
    bVar21 = auVar132._0_4_ < auVar50._0_4_ & (byte)(uVar28 >> 1) & 0x7f;
  }
  if (((!bVar32 || uVar4 != 0 && !bVar34) | bVar21) != 1) goto LAB_01818b9d;
  lVar25 = 0xc9;
  do {
    lVar25 = lVar25 + -1;
    if (lVar25 == 0) goto LAB_01817ca7;
    auVar40 = vsubss_avx512f(auVar43,auVar56);
    fVar209 = auVar40._0_4_;
    fVar213 = fVar209 * fVar209 * fVar209;
    fVar211 = auVar56._0_4_;
    fVar198 = fVar211 * 3.0 * fVar209 * fVar209;
    fVar209 = fVar209 * fVar211 * fVar211 * 3.0;
    auVar134._4_4_ = fVar213;
    auVar134._0_4_ = fVar213;
    auVar134._8_4_ = fVar213;
    auVar134._12_4_ = fVar213;
    auVar129._4_4_ = fVar198;
    auVar129._0_4_ = fVar198;
    auVar129._8_4_ = fVar198;
    auVar129._12_4_ = fVar198;
    auVar100._4_4_ = fVar209;
    auVar100._0_4_ = fVar209;
    auVar100._8_4_ = fVar209;
    auVar100._12_4_ = fVar209;
    fVar211 = fVar211 * fVar211 * fVar211;
    auVar158._0_4_ = (float)local_2a0._0_4_ * fVar211;
    auVar158._4_4_ = (float)local_2a0._4_4_ * fVar211;
    auVar158._8_4_ = fStack_298 * fVar211;
    auVar158._12_4_ = fStack_294 * fVar211;
    auVar40 = vfmadd231ps_fma(auVar158,auVar12,auVar100);
    auVar40 = vfmadd231ps_fma(auVar40,auVar38,auVar129);
    auVar40 = vfmadd231ps_fma(auVar40,auVar37,auVar134);
    auVar101._8_8_ = auVar40._0_8_;
    auVar101._0_8_ = auVar40._0_8_;
    auVar40 = vshufpd_avx(auVar40,auVar40,3);
    auVar50 = vshufps_avx(auVar56,auVar56,0x55);
    auVar40 = vsubps_avx(auVar40,auVar101);
    auVar50 = vfmadd213ps_fma(auVar40,auVar50,auVar101);
    fVar213 = auVar50._0_4_;
    auVar40 = vshufps_avx(auVar50,auVar50,0x55);
    auVar102._0_4_ = auVar51._0_4_ * fVar213 + auVar60._0_4_ * auVar40._0_4_;
    auVar102._4_4_ = auVar51._4_4_ * fVar213 + auVar60._4_4_ * auVar40._4_4_;
    auVar102._8_4_ = auVar51._8_4_ * fVar213 + auVar60._8_4_ * auVar40._8_4_;
    auVar102._12_4_ = auVar51._12_4_ * fVar213 + auVar60._12_4_ * auVar40._12_4_;
    auVar56 = vsubps_avx(auVar56,auVar102);
    auVar40 = vandps_avx512vl(auVar50,auVar241._0_16_);
    auVar50 = vprolq_avx512vl(auVar40,0x20);
    auVar40 = vmaxss_avx(auVar50,auVar40);
    bVar34 = (float)local_2b0._0_4_ < auVar40._0_4_;
  } while ((float)local_2b0._0_4_ <= auVar40._0_4_);
  auVar40 = vucomiss_avx512f(auVar58);
  if (bVar34) goto LAB_01817ca7;
  auVar51 = vucomiss_avx512f(auVar40);
  auVar244 = ZEXT1664(auVar51);
  if (bVar34) goto LAB_01817ca7;
  vmovshdup_avx(auVar40);
  auVar51 = vucomiss_avx512f(auVar58);
  if (bVar34) goto LAB_01817ca7;
  auVar50 = vucomiss_avx512f(auVar51);
  auVar244 = ZEXT1664(auVar50);
  if (bVar34) goto LAB_01817ca7;
  auVar43 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                          ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
  auVar57 = vinsertps_avx(auVar43,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),0x28);
  auVar43 = vdpps_avx(auVar57,local_2c0,0x7f);
  auVar44 = vdpps_avx(auVar57,local_2d0,0x7f);
  auVar49 = vdpps_avx(auVar57,local_2e0,0x7f);
  auVar59 = vdpps_avx(auVar57,local_2f0,0x7f);
  auVar63 = vdpps_avx(auVar57,local_300,0x7f);
  auVar54 = vdpps_avx(auVar57,local_310,0x7f);
  auVar55 = vdpps_avx(auVar57,local_320,0x7f);
  auVar57 = vdpps_avx(auVar57,local_330,0x7f);
  auVar56 = vsubss_avx512f(auVar50,auVar51);
  fVar213 = auVar51._0_4_;
  auVar51 = vfmadd231ss_fma(ZEXT416((uint)(fVar213 * auVar63._0_4_)),auVar56,auVar43);
  auVar43 = vfmadd231ss_fma(ZEXT416((uint)(auVar54._0_4_ * fVar213)),auVar56,auVar44);
  auVar44 = vfmadd231ss_fma(ZEXT416((uint)(auVar55._0_4_ * fVar213)),auVar56,auVar49);
  auVar49 = vfmadd231ss_fma(ZEXT416((uint)(fVar213 * auVar57._0_4_)),auVar56,auVar59);
  auVar50 = vsubss_avx512f(auVar50,auVar40);
  auVar159._0_4_ = auVar50._0_4_;
  fVar213 = auVar159._0_4_ * auVar159._0_4_ * auVar159._0_4_;
  local_120 = auVar40._0_4_;
  fVar198 = local_120 * 3.0 * auVar159._0_4_ * auVar159._0_4_;
  fVar209 = auVar159._0_4_ * local_120 * local_120 * 3.0;
  fVar208 = local_120 * local_120 * local_120;
  auVar50 = vfmadd231ss_fma(ZEXT416((uint)(fVar208 * auVar49._0_4_)),ZEXT416((uint)fVar209),auVar44)
  ;
  auVar50 = vfmadd231ss_fma(auVar50,ZEXT416((uint)fVar198),auVar43);
  auVar51 = vfmadd231ss_fma(auVar50,ZEXT416((uint)fVar213),auVar51);
  fVar211 = auVar51._0_4_;
  if ((fVar211 < fVar96) || (fVar210 = *(float *)(ray + k * 4 + 0x100), fVar210 < fVar211))
  goto LAB_01817ca7;
  auVar51 = vshufps_avx(auVar40,auVar40,0x55);
  auVar43 = vsubps_avx512vl(auVar45,auVar51);
  fVar212 = auVar51._0_4_;
  auVar191._0_4_ = fVar212 * (float)local_350._0_4_;
  fVar214 = auVar51._4_4_;
  auVar191._4_4_ = fVar214 * (float)local_350._4_4_;
  fVar222 = auVar51._8_4_;
  auVar191._8_4_ = fVar222 * fStack_348;
  fVar223 = auVar51._12_4_;
  auVar191._12_4_ = fVar223 * fStack_344;
  auVar195._0_4_ = fVar212 * (float)local_3a0._0_4_;
  auVar195._4_4_ = fVar214 * (float)local_3a0._4_4_;
  auVar195._8_4_ = fVar222 * fStack_398;
  auVar195._12_4_ = fVar223 * fStack_394;
  auVar206._0_4_ = fVar212 * (float)local_3b0._0_4_;
  auVar206._4_4_ = fVar214 * (float)local_3b0._4_4_;
  auVar206._8_4_ = fVar222 * fStack_3a8;
  auVar206._12_4_ = fVar223 * fStack_3a4;
  auVar170._0_4_ = fVar212 * (float)local_370._0_4_;
  auVar170._4_4_ = fVar214 * (float)local_370._4_4_;
  auVar170._8_4_ = fVar222 * fStack_368;
  auVar170._12_4_ = fVar223 * fStack_364;
  auVar51 = vfmadd231ps_fma(auVar191,auVar43,local_340);
  auVar50 = vfmadd231ps_fma(auVar195,auVar43,local_380);
  auVar45 = vfmadd231ps_fma(auVar206,auVar43,local_390);
  auVar43 = vfmadd231ps_fma(auVar170,auVar43,local_360);
  auVar51 = vsubps_avx(auVar50,auVar51);
  auVar50 = vsubps_avx(auVar45,auVar50);
  auVar45 = vsubps_avx(auVar43,auVar45);
  auVar207._0_4_ = local_120 * auVar50._0_4_;
  auVar207._4_4_ = local_120 * auVar50._4_4_;
  auVar207._8_4_ = local_120 * auVar50._8_4_;
  auVar207._12_4_ = local_120 * auVar50._12_4_;
  auVar159._4_4_ = auVar159._0_4_;
  auVar159._8_4_ = auVar159._0_4_;
  auVar159._12_4_ = auVar159._0_4_;
  auVar51 = vfmadd231ps_fma(auVar207,auVar159,auVar51);
  auVar171._0_4_ = local_120 * auVar45._0_4_;
  auVar171._4_4_ = local_120 * auVar45._4_4_;
  auVar171._8_4_ = local_120 * auVar45._8_4_;
  auVar171._12_4_ = local_120 * auVar45._12_4_;
  auVar50 = vfmadd231ps_fma(auVar171,auVar159,auVar50);
  auVar172._0_4_ = local_120 * auVar50._0_4_;
  auVar172._4_4_ = local_120 * auVar50._4_4_;
  auVar172._8_4_ = local_120 * auVar50._8_4_;
  auVar172._12_4_ = local_120 * auVar50._12_4_;
  auVar51 = vfmadd231ps_fma(auVar172,auVar159,auVar51);
  auVar17._8_4_ = 0x40400000;
  auVar17._0_8_ = 0x4040000040400000;
  auVar17._12_4_ = 0x40400000;
  auVar51 = vmulps_avx512vl(auVar51,auVar17);
  pGVar5 = (context->scene->geometries).items[uVar3].ptr;
  if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
       (bVar21 = 1, pGVar5->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_01818b8a;
    auVar147._0_4_ = fVar208 * (float)local_400._0_4_;
    auVar147._4_4_ = fVar208 * (float)local_400._4_4_;
    auVar147._8_4_ = fVar208 * fStack_3f8;
    auVar147._12_4_ = fVar208 * fStack_3f4;
    auVar135._4_4_ = fVar209;
    auVar135._0_4_ = fVar209;
    auVar135._8_4_ = fVar209;
    auVar135._12_4_ = fVar209;
    auVar50 = vfmadd132ps_fma(auVar135,auVar147,local_3f0);
    auVar130._4_4_ = fVar198;
    auVar130._0_4_ = fVar198;
    auVar130._8_4_ = fVar198;
    auVar130._12_4_ = fVar198;
    auVar50 = vfmadd132ps_fma(auVar130,auVar50,local_3e0);
    auVar116._4_4_ = fVar213;
    auVar116._0_4_ = fVar213;
    auVar116._8_4_ = fVar213;
    auVar116._12_4_ = fVar213;
    auVar43 = vfmadd132ps_fma(auVar116,auVar50,local_3d0);
    auVar50 = vshufps_avx(auVar43,auVar43,0xc9);
    auVar45 = vshufps_avx(auVar51,auVar51,0xc9);
    auVar117._0_4_ = auVar43._0_4_ * auVar45._0_4_;
    auVar117._4_4_ = auVar43._4_4_ * auVar45._4_4_;
    auVar117._8_4_ = auVar43._8_4_ * auVar45._8_4_;
    auVar117._12_4_ = auVar43._12_4_ * auVar45._12_4_;
    auVar51 = vfmsub231ps_fma(auVar117,auVar51,auVar50);
    auVar136._8_4_ = 1;
    auVar136._0_8_ = 0x100000001;
    auVar136._12_4_ = 1;
    auVar136._16_4_ = 1;
    auVar136._20_4_ = 1;
    auVar136._24_4_ = 1;
    auVar136._28_4_ = 1;
    local_100 = vpermps_avx2(auVar136,ZEXT1632(auVar40));
    auVar81 = vpermps_avx2(auVar136,ZEXT1632(auVar51));
    auVar148._8_4_ = 2;
    auVar148._0_8_ = 0x200000002;
    auVar148._12_4_ = 2;
    auVar148._16_4_ = 2;
    auVar148._20_4_ = 2;
    auVar148._24_4_ = 2;
    auVar148._28_4_ = 2;
    local_160 = vpermps_avx2(auVar148,ZEXT1632(auVar51));
    local_140 = auVar51._0_4_;
    local_180[0] = (RTCHitN)auVar81[0];
    local_180[1] = (RTCHitN)auVar81[1];
    local_180[2] = (RTCHitN)auVar81[2];
    local_180[3] = (RTCHitN)auVar81[3];
    local_180[4] = (RTCHitN)auVar81[4];
    local_180[5] = (RTCHitN)auVar81[5];
    local_180[6] = (RTCHitN)auVar81[6];
    local_180[7] = (RTCHitN)auVar81[7];
    local_180[8] = (RTCHitN)auVar81[8];
    local_180[9] = (RTCHitN)auVar81[9];
    local_180[10] = (RTCHitN)auVar81[10];
    local_180[0xb] = (RTCHitN)auVar81[0xb];
    local_180[0xc] = (RTCHitN)auVar81[0xc];
    local_180[0xd] = (RTCHitN)auVar81[0xd];
    local_180[0xe] = (RTCHitN)auVar81[0xe];
    local_180[0xf] = (RTCHitN)auVar81[0xf];
    local_180[0x10] = (RTCHitN)auVar81[0x10];
    local_180[0x11] = (RTCHitN)auVar81[0x11];
    local_180[0x12] = (RTCHitN)auVar81[0x12];
    local_180[0x13] = (RTCHitN)auVar81[0x13];
    local_180[0x14] = (RTCHitN)auVar81[0x14];
    local_180[0x15] = (RTCHitN)auVar81[0x15];
    local_180[0x16] = (RTCHitN)auVar81[0x16];
    local_180[0x17] = (RTCHitN)auVar81[0x17];
    local_180[0x18] = (RTCHitN)auVar81[0x18];
    local_180[0x19] = (RTCHitN)auVar81[0x19];
    local_180[0x1a] = (RTCHitN)auVar81[0x1a];
    local_180[0x1b] = (RTCHitN)auVar81[0x1b];
    local_180[0x1c] = (RTCHitN)auVar81[0x1c];
    local_180[0x1d] = (RTCHitN)auVar81[0x1d];
    local_180[0x1e] = (RTCHitN)auVar81[0x1e];
    local_180[0x1f] = (RTCHitN)auVar81[0x1f];
    uStack_13c = local_140;
    uStack_138 = local_140;
    uStack_134 = local_140;
    uStack_130 = local_140;
    uStack_12c = local_140;
    uStack_128 = local_140;
    uStack_124 = local_140;
    fStack_11c = local_120;
    fStack_118 = local_120;
    fStack_114 = local_120;
    fStack_110 = local_120;
    fStack_10c = local_120;
    fStack_108 = local_120;
    fStack_104 = local_120;
    local_e0 = local_200._0_8_;
    uStack_d8 = local_200._8_8_;
    uStack_d0 = local_200._16_8_;
    uStack_c8 = local_200._24_8_;
    local_c0 = local_220;
    vpcmpeqd_avx2(local_220,local_220);
    uStack_9c = context->user->instID[0];
    local_a0 = uStack_9c;
    uStack_98 = uStack_9c;
    uStack_94 = uStack_9c;
    uStack_90 = uStack_9c;
    uStack_8c = uStack_9c;
    uStack_88 = uStack_9c;
    uStack_84 = uStack_9c;
    uStack_7c = context->user->instPrimID[0];
    local_80 = uStack_7c;
    uStack_78 = uStack_7c;
    uStack_74 = uStack_7c;
    uStack_70 = uStack_7c;
    uStack_6c = uStack_7c;
    uStack_68 = uStack_7c;
    uStack_64 = uStack_7c;
    *(float *)(ray + k * 4 + 0x100) = fVar211;
    local_420 = local_240;
    local_450.valid = (int *)local_420;
    local_450.geometryUserPtr = pGVar5->userPtr;
    local_450.context = context->user;
    local_450.ray = (RTCRayN *)ray;
    local_450.hit = local_180;
    local_450.N = 8;
    if (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0) {
      (*pGVar5->occlusionFilterN)(&local_450);
      auVar240 = ZEXT3264(_DAT_01fb9fe0);
      auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
      auVar239 = ZEXT1664(auVar40);
      auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
      auVar237 = ZEXT1664(auVar40);
      auVar40 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar245 = ZEXT1664(auVar40);
      auVar40 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar241 = ZEXT1664(auVar40);
    }
    if (local_420 == (undefined1  [32])0x0) {
      auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar242 = ZEXT1664(auVar40);
      auVar81 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar238 = ZEXT3264(auVar81);
      auVar40 = vxorps_avx512vl(auVar58,auVar58);
      auVar243 = ZEXT1664(auVar40);
    }
    else {
      p_Var6 = context->args->filter;
      if (p_Var6 == (RTCFilterFunctionN)0x0) {
        auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar242 = ZEXT1664(auVar40);
        auVar81 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
        auVar238 = ZEXT3264(auVar81);
        auVar40 = vxorps_avx512vl(auVar58,auVar58);
        auVar243 = ZEXT1664(auVar40);
      }
      else {
        auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar242 = ZEXT1664(auVar40);
        auVar81 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
        auVar238 = ZEXT3264(auVar81);
        auVar40 = vxorps_avx512vl(auVar58,auVar58);
        auVar243 = ZEXT1664(auVar40);
        if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
             RTC_RAY_QUERY_FLAG_INCOHERENT) || (((pGVar5->field_8).field_0x2 & 0x40) != 0)) {
          (*p_Var6)(&local_450);
          auVar40 = vxorps_avx512vl(auVar40,auVar40);
          auVar243 = ZEXT1664(auVar40);
          auVar240 = ZEXT3264(_DAT_01fb9fe0);
          auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
          auVar239 = ZEXT1664(auVar40);
          auVar81 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
          auVar238 = ZEXT3264(auVar81);
          auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
          auVar237 = ZEXT1664(auVar40);
          auVar40 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
          auVar245 = ZEXT1664(auVar40);
          auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar242 = ZEXT1664(auVar40);
          auVar40 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          auVar241 = ZEXT1664(auVar40);
        }
      }
      auVar244 = ZEXT464(0x3f800000);
      uVar28 = vptestmd_avx512vl(local_420,local_420);
      auVar81 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      bVar34 = (bool)((byte)uVar28 & 1);
      bVar33 = (bool)((byte)(uVar28 >> 1) & 1);
      bVar32 = (bool)((byte)(uVar28 >> 2) & 1);
      bVar35 = (bool)((byte)(uVar28 >> 3) & 1);
      bVar36 = (bool)((byte)(uVar28 >> 4) & 1);
      bVar9 = (bool)((byte)(uVar28 >> 5) & 1);
      bVar10 = (bool)((byte)(uVar28 >> 6) & 1);
      bVar11 = SUB81(uVar28 >> 7,0);
      *(uint *)(local_450.ray + 0x100) =
           (uint)bVar34 * auVar81._0_4_ | (uint)!bVar34 * *(int *)(local_450.ray + 0x100);
      *(uint *)(local_450.ray + 0x104) =
           (uint)bVar33 * auVar81._4_4_ | (uint)!bVar33 * *(int *)(local_450.ray + 0x104);
      *(uint *)(local_450.ray + 0x108) =
           (uint)bVar32 * auVar81._8_4_ | (uint)!bVar32 * *(int *)(local_450.ray + 0x108);
      *(uint *)(local_450.ray + 0x10c) =
           (uint)bVar35 * auVar81._12_4_ | (uint)!bVar35 * *(int *)(local_450.ray + 0x10c);
      *(uint *)(local_450.ray + 0x110) =
           (uint)bVar36 * auVar81._16_4_ | (uint)!bVar36 * *(int *)(local_450.ray + 0x110);
      *(uint *)(local_450.ray + 0x114) =
           (uint)bVar9 * auVar81._20_4_ | (uint)!bVar9 * *(int *)(local_450.ray + 0x114);
      *(uint *)(local_450.ray + 0x118) =
           (uint)bVar10 * auVar81._24_4_ | (uint)!bVar10 * *(int *)(local_450.ray + 0x118);
      *(uint *)(local_450.ray + 0x11c) =
           (uint)bVar11 * auVar81._28_4_ | (uint)!bVar11 * *(int *)(local_450.ray + 0x11c);
      bVar21 = 1;
      if (local_420 != (undefined1  [32])0x0) goto LAB_01818b8a;
    }
    auVar244 = ZEXT464(0x3f800000);
    *(float *)(ray + k * 4 + 0x100) = fVar210;
  }
  bVar21 = 0;
LAB_01818b8a:
  bVar31 = (bool)(bVar31 | bVar21);
  goto LAB_01817ca7;
LAB_01818b9d:
  auVar108 = vinsertps_avx(auVar132,auVar52,0x10);
  goto LAB_01817745;
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }